

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ushort uVar20;
  ushort uVar21;
  int iVar22;
  size_t sVar23;
  Geometry *pGVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  byte bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [12];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar45;
  int iVar46;
  AABBNodeMB4D *node1;
  long lVar47;
  ulong uVar48;
  long lVar49;
  ulong uVar50;
  long lVar51;
  ulong uVar52;
  RTCRayN *pRVar53;
  long lVar54;
  uint uVar55;
  undefined4 uVar56;
  ulong uVar57;
  long lVar58;
  long lVar59;
  ulong uVar60;
  long lVar61;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar62;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  size_t sVar66;
  long lVar67;
  long lVar68;
  ulong uVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  byte bVar73;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  byte bVar107;
  byte bVar108;
  byte bVar109;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar94;
  float fVar110;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar103;
  float fVar111;
  float fVar130;
  float fVar132;
  vint4 ai;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar115;
  uint uVar131;
  uint uVar133;
  uint uVar134;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar135;
  uint uVar136;
  uint uVar147;
  uint uVar148;
  vint4 ai_2;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar140;
  uint uVar149;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar150;
  uint uVar151;
  float fVar167;
  float fVar169;
  vint4 bi;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  uint uVar168;
  uint uVar170;
  float fVar171;
  uint uVar172;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar173;
  float fVar184;
  float fVar185;
  vint4 ai_5;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar178;
  undefined1 auVar179 [16];
  float fVar186;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar187;
  vint4 ai_1;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  uint uVar194;
  float fVar201;
  uint uVar202;
  undefined8 uVar195;
  float fVar203;
  vint4 bi_1;
  undefined1 auVar196 [16];
  uint uVar204;
  uint uVar205;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar206;
  float fVar207;
  float fVar213;
  float fVar215;
  vint4 ai_7;
  float fVar217;
  undefined1 auVar208 [16];
  float fVar214;
  float fVar216;
  float fVar218;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar228;
  float fVar232;
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar223;
  float fVar229;
  float fVar230;
  float fVar233;
  float fVar234;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar224 [16];
  float fVar231;
  float fVar235;
  float fVar236;
  float fVar240;
  float fVar241;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar246;
  float fVar247;
  undefined1 auVar242 [16];
  float fVar248;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar249;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar262;
  float fVar263;
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  UVIdentity<4> mapUV;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined1 local_14d8 [8];
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14a0;
  float fStack_149c;
  float fStack_147c;
  float local_1478;
  float fStack_1474;
  float local_1468;
  float fStack_1464;
  float fStack_1460;
  float fStack_145c;
  vbool<4> valid;
  undefined1 local_1448 [16];
  ulong local_1430;
  undefined8 local_1428;
  float fStack_1420;
  float fStack_141c;
  undefined8 local_1418;
  float fStack_1410;
  float fStack_140c;
  RTCFilterFunctionNArguments args;
  ulong local_13a0;
  float local_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float local_1388;
  float fStack_1384;
  float fStack_1380;
  float fStack_137c;
  vfloat<4> tNear;
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [16];
  vint4 bi_2;
  undefined1 local_1298 [12];
  float fStack_128c;
  float fStack_1280;
  float fStack_127c;
  float fStack_1270;
  float fStack_126c;
  undefined8 local_1268;
  vint4 bi_5;
  undefined4 local_1178;
  undefined4 uStack_1174;
  undefined4 uStack_1170;
  undefined4 uStack_116c;
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined4 local_1148;
  undefined4 uStack_1144;
  undefined4 uStack_1140;
  undefined4 uStack_113c;
  undefined1 local_1138 [16];
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  uint local_1108;
  uint uStack_1104;
  uint uStack_1100;
  uint uStack_10fc;
  uint local_10f8;
  uint uStack_10f4;
  uint uStack_10f0;
  uint uStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined1 local_10c8 [16];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined8 local_1078;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  vfloat<4> dist;
  vint<4> itime;
  vfloat<4> ftime;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar62 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar171 = *(float *)((long)&(tray->org).field_0 + k * 4);
  uVar56 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar186 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar83._4_4_ = uVar56;
  auVar83._0_4_ = uVar56;
  auVar83._8_4_ = uVar56;
  auVar83._12_4_ = uVar56;
  fVar249 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar254 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar259 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar262 = fVar249 * 0.99999964;
  fVar270 = fVar254 * 0.99999964;
  fVar269 = fVar259 * 0.99999964;
  fVar249 = fVar249 * 1.0000004;
  fVar254 = fVar254 * 1.0000004;
  fVar259 = fVar259 * 1.0000004;
  uVar63 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar65 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  iVar22 = *(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar69 = (ulong)iVar22;
  uVar57 = uVar69 ^ 0x10;
  iVar46 = (tray->tnear).field_0.i[k];
  aVar223.i[1] = iVar46;
  aVar223.i[0] = iVar46;
  aVar223.i[2] = iVar46;
  aVar223.i[3] = iVar46;
  iVar46 = (tray->tfar).field_0.i[k];
  auVar242._4_4_ = iVar46;
  auVar242._0_4_ = iVar46;
  auVar242._8_4_ = iVar46;
  auVar242._12_4_ = iVar46;
  uVar52 = k & 0xffffffff;
  lVar47 = (long)(1 << ((byte)uVar52 & 0x1f)) * 0x10;
  bi_2.field_0 = aVar223;
  local_10b8 = fVar171;
  fStack_10b4 = fVar171;
  fStack_10b0 = fVar171;
  fStack_10ac = fVar171;
  local_10c8 = auVar83;
  local_10d8 = fVar186;
  fStack_10d4 = fVar186;
  fStack_10d0 = fVar186;
  fStack_10cc = fVar186;
  local_10e8 = fVar262;
  fStack_10e4 = fVar262;
  fStack_10e0 = fVar262;
  fStack_10dc = fVar262;
  fVar132 = fVar262;
  fVar130 = fVar262;
  fVar111 = fVar262;
  fVar169 = fVar171;
  fVar167 = fVar171;
  fVar150 = fVar171;
  fVar110 = fVar186;
  fVar185 = fVar186;
  fVar184 = fVar186;
LAB_0073ae00:
  do {
    do {
      if (pSVar62 == stack) {
        return;
      }
      pSVar45 = pSVar62 + -1;
      pSVar62 = pSVar62 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar45->dist &&
             (float)pSVar45->dist != *(float *)(ray + k * 4 + 0x80));
    sVar66 = (pSVar62->ptr).ptr;
    while ((sVar66 & 8) == 0) {
      uVar48 = sVar66 & 0xfffffffffffffff0;
      fVar238 = *(float *)(ray + k * 4 + 0x70);
      pfVar15 = (float *)(uVar48 + 0x80 + uVar63);
      pfVar14 = (float *)(uVar48 + 0x20 + uVar63);
      auVar137._0_4_ = ((*pfVar15 * fVar238 + *pfVar14) - fVar150) * fVar111;
      auVar137._4_4_ = ((pfVar15[1] * fVar238 + pfVar14[1]) - fVar167) * fVar130;
      auVar137._8_4_ = ((pfVar15[2] * fVar238 + pfVar14[2]) - fVar169) * fVar132;
      auVar137._12_4_ = ((pfVar15[3] * fVar238 + pfVar14[3]) - fVar171) * fVar262;
      pfVar15 = (float *)(uVar48 + 0x80 + uVar65);
      pfVar14 = (float *)(uVar48 + 0x20 + uVar65);
      auVar152._0_4_ = ((*pfVar15 * fVar238 + *pfVar14) - auVar83._0_4_) * fVar270;
      auVar152._4_4_ = ((pfVar15[1] * fVar238 + pfVar14[1]) - auVar83._4_4_) * fVar270;
      auVar152._8_4_ = ((pfVar15[2] * fVar238 + pfVar14[2]) - auVar83._8_4_) * fVar270;
      auVar152._12_4_ = ((pfVar15[3] * fVar238 + pfVar14[3]) - auVar83._12_4_) * fVar270;
      pfVar15 = (float *)(uVar48 + 0x80 + uVar69);
      pfVar14 = (float *)(uVar48 + 0x20 + uVar69);
      auVar112._0_4_ = ((*pfVar15 * fVar238 + *pfVar14) - fVar184) * fVar269;
      auVar112._4_4_ = ((pfVar15[1] * fVar238 + pfVar14[1]) - fVar185) * fVar269;
      auVar112._8_4_ = ((pfVar15[2] * fVar238 + pfVar14[2]) - fVar110) * fVar269;
      auVar112._12_4_ = ((pfVar15[3] * fVar238 + pfVar14[3]) - fVar186) * fVar269;
      auVar153 = maxps(auVar152,auVar112);
      auVar113 = maxps((undefined1  [16])aVar223,auVar137);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar113,auVar153);
      pfVar15 = (float *)(uVar48 + 0x80 + (uVar63 ^ 0x10));
      pfVar14 = (float *)(uVar48 + 0x20 + (uVar63 ^ 0x10));
      auVar154._0_4_ = ((*pfVar15 * fVar238 + *pfVar14) - fVar150) * fVar249;
      auVar154._4_4_ = ((pfVar15[1] * fVar238 + pfVar14[1]) - fVar167) * fVar249;
      auVar154._8_4_ = ((pfVar15[2] * fVar238 + pfVar14[2]) - fVar169) * fVar249;
      auVar154._12_4_ = ((pfVar15[3] * fVar238 + pfVar14[3]) - fVar171) * fVar249;
      pfVar15 = (float *)(uVar48 + 0x80 + (uVar65 ^ 0x10));
      pfVar14 = (float *)(uVar48 + 0x20 + (uVar65 ^ 0x10));
      auVar174._0_4_ = ((*pfVar15 * fVar238 + *pfVar14) - auVar83._0_4_) * fVar254;
      auVar174._4_4_ = ((pfVar15[1] * fVar238 + pfVar14[1]) - auVar83._4_4_) * fVar254;
      auVar174._8_4_ = ((pfVar15[2] * fVar238 + pfVar14[2]) - auVar83._8_4_) * fVar254;
      auVar174._12_4_ = ((pfVar15[3] * fVar238 + pfVar14[3]) - auVar83._12_4_) * fVar254;
      pfVar15 = (float *)(uVar48 + 0x80 + uVar57);
      pfVar14 = (float *)(uVar48 + 0x20 + uVar57);
      auVar138._0_4_ = ((*pfVar15 * fVar238 + *pfVar14) - fVar184) * fVar259;
      auVar138._4_4_ = ((pfVar15[1] * fVar238 + pfVar14[1]) - fVar185) * fVar259;
      auVar138._8_4_ = ((pfVar15[2] * fVar238 + pfVar14[2]) - fVar110) * fVar259;
      auVar138._12_4_ = ((pfVar15[3] * fVar238 + pfVar14[3]) - fVar186) * fVar259;
      auVar153 = minps(auVar174,auVar138);
      auVar113 = minps(auVar242,auVar154);
      auVar113 = minps(auVar113,auVar153);
      if (((uint)sVar66 & 7) == 6) {
        bVar27 = (fVar238 < *(float *)(uVar48 + 0xf0) && *(float *)(uVar48 + 0xe0) <= fVar238) &&
                 tNear.field_0._0_4_ <= auVar113._0_4_;
        bVar28 = (fVar238 < *(float *)(uVar48 + 0xf4) && *(float *)(uVar48 + 0xe4) <= fVar238) &&
                 tNear.field_0._4_4_ <= auVar113._4_4_;
        bVar29 = (fVar238 < *(float *)(uVar48 + 0xf8) && *(float *)(uVar48 + 0xe8) <= fVar238) &&
                 tNear.field_0._8_4_ <= auVar113._8_4_;
        bVar30 = (fVar238 < *(float *)(uVar48 + 0xfc) && *(float *)(uVar48 + 0xec) <= fVar238) &&
                 tNear.field_0._12_4_ <= auVar113._12_4_;
      }
      else {
        bVar27 = tNear.field_0._0_4_ <= auVar113._0_4_;
        bVar28 = tNear.field_0._4_4_ <= auVar113._4_4_;
        bVar29 = tNear.field_0._8_4_ <= auVar113._8_4_;
        bVar30 = tNear.field_0._12_4_ <= auVar113._12_4_;
      }
      auVar74._0_4_ = (uint)bVar27 * -0x80000000;
      auVar74._4_4_ = (uint)bVar28 * -0x80000000;
      auVar74._8_4_ = (uint)bVar29 * -0x80000000;
      auVar74._12_4_ = (uint)bVar30 * -0x80000000;
      uVar55 = movmskps((int)uVar57,auVar74);
      uVar52 = CONCAT44(iVar22 >> 0x1f,uVar55);
      if (uVar55 == 0) goto LAB_0073ae00;
      uVar52 = 0;
      if ((byte)uVar55 != 0) {
        for (; ((byte)uVar55 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
        }
      }
      sVar66 = *(size_t *)(uVar48 + uVar52 * 8);
      uVar55 = (uVar55 & 0xff) - 1 & uVar55 & 0xff;
      if (uVar55 != 0) {
        uVar131 = tNear.field_0.i[uVar52];
        lVar54 = 0;
        if (uVar55 != 0) {
          for (; (uVar55 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
          }
        }
        sVar23 = *(size_t *)(uVar48 + lVar54 * 8);
        uVar133 = tNear.field_0.i[lVar54];
        uVar55 = uVar55 - 1 & uVar55;
        uVar52 = (ulong)uVar55;
        if (uVar55 == 0) {
          if (uVar131 < uVar133) {
            (pSVar62->ptr).ptr = sVar23;
            pSVar62->dist = uVar133;
            pSVar62 = pSVar62 + 1;
          }
          else {
            (pSVar62->ptr).ptr = sVar66;
            pSVar62->dist = uVar131;
            pSVar62 = pSVar62 + 1;
            sVar66 = sVar23;
          }
        }
        else {
          auVar114._8_4_ = uVar131;
          auVar114._0_8_ = sVar66;
          auVar114._12_4_ = 0;
          auVar155._8_4_ = uVar133;
          auVar155._0_8_ = sVar23;
          auVar155._12_4_ = 0;
          lVar54 = 0;
          if (uVar52 != 0) {
            for (; (uVar55 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
            }
          }
          uVar195 = *(undefined8 *)(uVar48 + lVar54 * 8);
          iVar46 = tNear.field_0.i[lVar54];
          auVar139._8_4_ = iVar46;
          auVar139._0_8_ = uVar195;
          auVar139._12_4_ = 0;
          auVar75._8_4_ = -(uint)((int)uVar131 < (int)uVar133);
          uVar55 = uVar55 - 1 & uVar55;
          if (uVar55 == 0) {
            auVar75._4_4_ = auVar75._8_4_;
            auVar75._0_4_ = auVar75._8_4_;
            auVar75._12_4_ = auVar75._8_4_;
            auVar175._8_4_ = uVar133;
            auVar175._0_8_ = sVar23;
            auVar175._12_4_ = 0;
            auVar176 = blendvps(auVar175,auVar114,auVar75);
            auVar113 = blendvps(auVar114,auVar155,auVar75);
            auVar76._8_4_ = -(uint)(auVar176._8_4_ < iVar46);
            auVar76._4_4_ = auVar76._8_4_;
            auVar76._0_4_ = auVar76._8_4_;
            auVar76._12_4_ = auVar76._8_4_;
            auVar156._8_4_ = iVar46;
            auVar156._0_8_ = uVar195;
            auVar156._12_4_ = 0;
            auVar153 = blendvps(auVar156,auVar176,auVar76);
            auVar176 = blendvps(auVar176,auVar139,auVar76);
            auVar77._8_4_ = -(uint)(auVar113._8_4_ < auVar176._8_4_);
            auVar77._4_4_ = auVar77._8_4_;
            auVar77._0_4_ = auVar77._8_4_;
            auVar77._12_4_ = auVar77._8_4_;
            SVar140 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar176,auVar113,auVar77);
            SVar115 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar113,auVar176,auVar77);
            *pSVar62 = SVar115;
            pSVar62[1] = SVar140;
            sVar66 = auVar153._0_8_;
            pSVar62 = pSVar62 + 2;
          }
          else {
            uVar52 = 0;
            if (uVar55 != 0) {
              for (; (uVar55 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
              }
            }
            auVar78._4_4_ = auVar75._8_4_;
            auVar78._0_4_ = auVar75._8_4_;
            auVar78._8_4_ = auVar75._8_4_;
            auVar78._12_4_ = auVar75._8_4_;
            auVar177 = blendvps(auVar155,auVar114,auVar78);
            auVar113 = blendvps(auVar114,auVar155,auVar78);
            auVar188._8_4_ = tNear.field_0.i[uVar52];
            auVar188._0_8_ = *(undefined8 *)(uVar48 + uVar52 * 8);
            auVar188._12_4_ = 0;
            auVar79._8_4_ = -(uint)(iVar46 < tNear.field_0.i[uVar52]);
            auVar79._4_4_ = auVar79._8_4_;
            auVar79._0_4_ = auVar79._8_4_;
            auVar79._12_4_ = auVar79._8_4_;
            auVar176 = blendvps(auVar188,auVar139,auVar79);
            auVar153 = blendvps(auVar139,auVar188,auVar79);
            auVar80._8_4_ = -(uint)(auVar113._8_4_ < auVar153._8_4_);
            auVar80._4_4_ = auVar80._8_4_;
            auVar80._0_4_ = auVar80._8_4_;
            auVar80._12_4_ = auVar80._8_4_;
            auVar189 = blendvps(auVar153,auVar113,auVar80);
            SVar115 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar113,auVar153,auVar80);
            auVar81._8_4_ = -(uint)(auVar177._8_4_ < auVar176._8_4_);
            auVar81._4_4_ = auVar81._8_4_;
            auVar81._0_4_ = auVar81._8_4_;
            auVar81._12_4_ = auVar81._8_4_;
            auVar113 = blendvps(auVar176,auVar177,auVar81);
            auVar153 = blendvps(auVar177,auVar176,auVar81);
            auVar82._8_4_ = -(uint)(auVar153._8_4_ < auVar189._8_4_);
            auVar82._4_4_ = auVar82._8_4_;
            auVar82._0_4_ = auVar82._8_4_;
            auVar82._12_4_ = auVar82._8_4_;
            SVar140 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar189,auVar153,auVar82);
            SVar178 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar153,auVar189,auVar82);
            *pSVar62 = SVar115;
            pSVar62[1] = SVar178;
            pSVar62[2] = SVar140;
            sVar66 = auVar113._0_8_;
            pSVar62 = pSVar62 + 3;
            aVar223 = bi_2.field_0;
          }
        }
      }
    }
    local_1268 = (ulong)((uint)sVar66 & 0xf) - 8;
    uVar48 = sVar66 & 0xfffffffffffffff0;
    for (lVar54 = 0; lVar54 != local_1268; lVar54 = lVar54 + 1) {
      lVar49 = lVar54 * 0x90;
      fVar135 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(uVar48 + 0x80 + lVar49)) *
                *(float *)(uVar48 + 0x84 + lVar49);
      uVar50 = *(ulong *)(uVar48 + 0x20 + lVar49);
      auVar153._8_8_ = 0;
      auVar153._0_8_ = uVar50;
      uVar60 = *(ulong *)(uVar48 + 0x24 + lVar49);
      auVar189._8_8_ = 0;
      auVar189._0_8_ = uVar60;
      bVar31 = (byte)uVar60;
      bVar73 = (byte)uVar50;
      bVar32 = (byte)(uVar60 >> 8);
      bVar104 = (byte)(uVar50 >> 8);
      bVar33 = (byte)(uVar60 >> 0x10);
      bVar105 = (byte)(uVar50 >> 0x10);
      bVar34 = (byte)(uVar60 >> 0x18);
      bVar106 = (byte)(uVar50 >> 0x18);
      bVar35 = (byte)(uVar60 >> 0x20);
      bVar107 = (byte)(uVar50 >> 0x20);
      bVar36 = (byte)(uVar60 >> 0x28);
      bVar108 = (byte)(uVar50 >> 0x28);
      bVar37 = (byte)(uVar60 >> 0x30);
      bVar109 = (byte)(uVar50 >> 0x30);
      bVar42 = (byte)(uVar50 >> 0x38);
      bVar38 = (byte)(uVar60 >> 0x38);
      auVar113[0] = -((byte)((bVar31 < bVar73) * bVar31 | (bVar31 >= bVar73) * bVar73) == bVar73);
      auVar113[1] = -((byte)((bVar32 < bVar104) * bVar32 | (bVar32 >= bVar104) * bVar104) == bVar104
                     );
      auVar113[2] = -((byte)((bVar33 < bVar105) * bVar33 | (bVar33 >= bVar105) * bVar105) == bVar105
                     );
      auVar113[3] = -((byte)((bVar34 < bVar106) * bVar34 | (bVar34 >= bVar106) * bVar106) == bVar106
                     );
      auVar113[4] = -((byte)((bVar35 < bVar107) * bVar35 | (bVar35 >= bVar107) * bVar107) == bVar107
                     );
      auVar113[5] = -((byte)((bVar36 < bVar108) * bVar36 | (bVar36 >= bVar108) * bVar108) == bVar108
                     );
      auVar113[6] = -((byte)((bVar37 < bVar109) * bVar37 | (bVar37 >= bVar109) * bVar109) == bVar109
                     );
      auVar113[7] = -((byte)((bVar38 < bVar42) * bVar38 | (bVar38 >= bVar42) * bVar42) == bVar42);
      auVar113[8] = 0xff;
      auVar113[9] = 0xff;
      auVar113[10] = 0xff;
      auVar113[0xb] = 0xff;
      auVar113[0xc] = 0xff;
      auVar113[0xd] = 0xff;
      auVar113[0xe] = 0xff;
      auVar113[0xf] = 0xff;
      auVar153 = pmovzxbd(auVar153,auVar153);
      fVar238 = *(float *)(uVar48 + 0x38 + lVar49);
      fVar218 = *(float *)(uVar48 + 0x3c + lVar49);
      fVar240 = *(float *)(uVar48 + 0x40 + lVar49);
      fVar187 = *(float *)(uVar48 + 0x44 + lVar49);
      fVar219 = (float)auVar153._0_4_ * fVar187 + fVar238;
      fVar228 = (float)auVar153._4_4_ * fVar187 + fVar238;
      fVar232 = (float)auVar153._8_4_ * fVar187 + fVar238;
      fVar237 = (float)auVar153._12_4_ * fVar187 + fVar238;
      auVar176._8_8_ = 0;
      auVar176._0_8_ = *(ulong *)(uVar48 + 0x50 + lVar49);
      auVar153 = pmovzxbd(auVar176,auVar176);
      fVar201 = *(float *)(uVar48 + 0x74 + lVar49);
      fVar203 = *(float *)(uVar48 + 0x68 + lVar49);
      auVar176 = pmovzxbd(auVar189,auVar189);
      fVar220 = (float)auVar176._0_4_ * fVar187 + fVar238;
      fVar229 = (float)auVar176._4_4_ * fVar187 + fVar238;
      fVar233 = (float)auVar176._8_4_ * fVar187 + fVar238;
      fVar238 = (float)auVar176._12_4_ * fVar187 + fVar238;
      auVar157._8_8_ = 0;
      auVar157._0_8_ = *(ulong *)(uVar48 + 0x54 + lVar49);
      auVar176 = pmovzxbd(auVar157,auVar157);
      auVar190._8_8_ = 0;
      auVar190._0_8_ = *(ulong *)(uVar48 + 0x28 + lVar49);
      auVar177 = pmovzxbd(auVar190,auVar190);
      fVar187 = *(float *)(uVar48 + 0x48 + lVar49);
      fVar206 = (float)auVar177._0_4_ * fVar187 + fVar218;
      fVar213 = (float)auVar177._4_4_ * fVar187 + fVar218;
      fVar215 = (float)auVar177._8_4_ * fVar187 + fVar218;
      fVar217 = (float)auVar177._12_4_ * fVar187 + fVar218;
      auVar191._8_8_ = 0;
      auVar191._0_8_ = *(ulong *)(uVar48 + 0x58 + lVar49);
      auVar189 = pmovzxbd(auVar191,auVar191);
      fVar246 = *(float *)(uVar48 + 0x78 + lVar49);
      fVar247 = *(float *)(uVar48 + 0x6c + lVar49);
      auVar208._8_8_ = 0;
      auVar208._0_8_ = *(ulong *)(uVar48 + 0x2c + lVar49);
      auVar177 = pmovzxbd(auVar208,auVar208);
      fVar207 = (float)auVar177._0_4_ * fVar187 + fVar218;
      fVar214 = (float)auVar177._4_4_ * fVar187 + fVar218;
      fVar216 = (float)auVar177._8_4_ * fVar187 + fVar218;
      fVar218 = (float)auVar177._12_4_ * fVar187 + fVar218;
      auVar196._8_8_ = 0;
      auVar196._0_8_ = *(ulong *)(uVar48 + 0x5c + lVar49);
      auVar157 = pmovzxbd(auVar196,auVar196);
      auVar209._8_8_ = 0;
      auVar209._0_8_ = *(ulong *)(uVar48 + 0x30 + lVar49);
      auVar177 = pmovzxbd(auVar209,auVar209);
      fVar187 = *(float *)(uVar48 + 0x4c + lVar49);
      fVar221 = (float)auVar177._0_4_ * fVar187 + fVar240;
      fVar230 = (float)auVar177._4_4_ * fVar187 + fVar240;
      fVar234 = (float)auVar177._8_4_ * fVar187 + fVar240;
      fVar239 = (float)auVar177._12_4_ * fVar187 + fVar240;
      auVar210._8_8_ = 0;
      auVar210._0_8_ = *(ulong *)(uVar48 + 0x60 + lVar49);
      auVar190 = pmovzxbd(auVar210,auVar210);
      fVar248 = *(float *)(uVar48 + 0x7c + lVar49);
      fVar173 = *(float *)(uVar48 + 0x70 + lVar49);
      auVar224._8_8_ = 0;
      auVar224._0_8_ = *(ulong *)(uVar48 + 0x34 + lVar49);
      auVar177 = pmovzxbd(auVar224,auVar224);
      fVar222 = (float)auVar177._0_4_ * fVar187 + fVar240;
      fVar231 = (float)auVar177._4_4_ * fVar187 + fVar240;
      fVar235 = (float)auVar177._8_4_ * fVar187 + fVar240;
      fVar240 = (float)auVar177._12_4_ * fVar187 + fVar240;
      auVar179._8_8_ = 0;
      auVar179._0_8_ = *(ulong *)(uVar48 + 100 + lVar49);
      auVar177 = pmovzxbd(auVar179,auVar179);
      fVar111 = (((((float)auVar153._0_4_ * fVar201 + fVar203) - fVar219) * fVar135 + fVar219) -
                fVar150) * fVar111;
      fVar130 = (((((float)auVar153._4_4_ * fVar201 + fVar203) - fVar228) * fVar135 + fVar228) -
                fVar167) * fVar130;
      fVar132 = (((((float)auVar153._8_4_ * fVar201 + fVar203) - fVar232) * fVar135 + fVar232) -
                fVar169) * fVar132;
      fVar262 = (((((float)auVar153._12_4_ * fVar201 + fVar203) - fVar237) * fVar135 + fVar237) -
                fVar171) * fVar262;
      fVar187 = (((((float)auVar189._0_4_ * fVar246 + fVar247) - fVar206) * fVar135 + fVar206) -
                auVar83._0_4_) * fVar270;
      fVar206 = (((((float)auVar189._4_4_ * fVar246 + fVar247) - fVar213) * fVar135 + fVar213) -
                auVar83._4_4_) * fVar270;
      fVar213 = (((((float)auVar189._8_4_ * fVar246 + fVar247) - fVar215) * fVar135 + fVar215) -
                auVar83._8_4_) * fVar270;
      fVar215 = (((((float)auVar189._12_4_ * fVar246 + fVar247) - fVar217) * fVar135 + fVar217) -
                auVar83._12_4_) * fVar270;
      fVar150 = (((((float)auVar176._0_4_ * fVar201 + fVar203) - fVar220) * fVar135 + fVar220) -
                fVar150) * fVar249;
      fVar167 = (((((float)auVar176._4_4_ * fVar201 + fVar203) - fVar229) * fVar135 + fVar229) -
                fVar167) * fVar249;
      fVar169 = (((((float)auVar176._8_4_ * fVar201 + fVar203) - fVar233) * fVar135 + fVar233) -
                fVar169) * fVar249;
      fVar171 = (((((float)auVar176._12_4_ * fVar201 + fVar203) - fVar238) * fVar135 + fVar238) -
                fVar171) * fVar249;
      fVar238 = (((((float)auVar157._0_4_ * fVar246 + fVar247) - fVar207) * fVar135 + fVar207) -
                auVar83._0_4_) * fVar254;
      fVar201 = (((((float)auVar157._4_4_ * fVar246 + fVar247) - fVar214) * fVar135 + fVar214) -
                auVar83._4_4_) * fVar254;
      fVar203 = (((((float)auVar157._8_4_ * fVar246 + fVar247) - fVar216) * fVar135 + fVar216) -
                auVar83._8_4_) * fVar254;
      fVar218 = (((((float)auVar157._12_4_ * fVar246 + fVar247) - fVar218) * fVar135 + fVar218) -
                auVar83._12_4_) * fVar254;
      uVar136 = (uint)((int)fVar150 < (int)fVar111) * (int)fVar150 |
                (uint)((int)fVar150 >= (int)fVar111) * (int)fVar111;
      uVar147 = (uint)((int)fVar167 < (int)fVar130) * (int)fVar167 |
                (uint)((int)fVar167 >= (int)fVar130) * (int)fVar130;
      uVar148 = (uint)((int)fVar169 < (int)fVar132) * (int)fVar169 |
                (uint)((int)fVar169 >= (int)fVar132) * (int)fVar132;
      uVar149 = (uint)((int)fVar171 < (int)fVar262) * (int)fVar171 |
                (uint)((int)fVar171 >= (int)fVar262) * (int)fVar262;
      uVar151 = (uint)((int)fVar150 < (int)fVar111) * (int)fVar111 |
                (uint)((int)fVar150 >= (int)fVar111) * (int)fVar150;
      uVar168 = (uint)((int)fVar167 < (int)fVar130) * (int)fVar130 |
                (uint)((int)fVar167 >= (int)fVar130) * (int)fVar167;
      uVar170 = (uint)((int)fVar169 < (int)fVar132) * (int)fVar132 |
                (uint)((int)fVar169 >= (int)fVar132) * (int)fVar169;
      uVar172 = (uint)((int)fVar171 < (int)fVar262) * (int)fVar262 |
                (uint)((int)fVar171 >= (int)fVar262) * (int)fVar171;
      uVar55 = (uint)((int)fVar238 < (int)fVar187) * (int)fVar238 |
               (uint)((int)fVar238 >= (int)fVar187) * (int)fVar187;
      uVar131 = (uint)((int)fVar201 < (int)fVar206) * (int)fVar201 |
                (uint)((int)fVar201 >= (int)fVar206) * (int)fVar206;
      uVar133 = (uint)((int)fVar203 < (int)fVar213) * (int)fVar203 |
                (uint)((int)fVar203 >= (int)fVar213) * (int)fVar213;
      uVar134 = (uint)((int)fVar218 < (int)fVar215) * (int)fVar218 |
                (uint)((int)fVar218 >= (int)fVar215) * (int)fVar215;
      uVar55 = ((int)uVar55 < (int)uVar136) * uVar136 | ((int)uVar55 >= (int)uVar136) * uVar55;
      uVar131 = ((int)uVar131 < (int)uVar147) * uVar147 | ((int)uVar131 >= (int)uVar147) * uVar131;
      uVar133 = ((int)uVar133 < (int)uVar148) * uVar148 | ((int)uVar133 >= (int)uVar148) * uVar133;
      uVar134 = ((int)uVar134 < (int)uVar149) * uVar149 | ((int)uVar134 >= (int)uVar149) * uVar134;
      uVar136 = (uint)((int)fVar238 < (int)fVar187) * (int)fVar187 |
                (uint)((int)fVar238 >= (int)fVar187) * (int)fVar238;
      uVar147 = (uint)((int)fVar201 < (int)fVar206) * (int)fVar206 |
                (uint)((int)fVar201 >= (int)fVar206) * (int)fVar201;
      uVar148 = (uint)((int)fVar203 < (int)fVar213) * (int)fVar213 |
                (uint)((int)fVar203 >= (int)fVar213) * (int)fVar203;
      uVar149 = (uint)((int)fVar218 < (int)fVar215) * (int)fVar215 |
                (uint)((int)fVar218 >= (int)fVar215) * (int)fVar218;
      fVar150 = (((((float)auVar190._0_4_ * fVar248 + fVar173) - fVar221) * fVar135 + fVar221) -
                fVar184) * fVar269;
      fVar167 = (((((float)auVar190._4_4_ * fVar248 + fVar173) - fVar230) * fVar135 + fVar230) -
                fVar185) * fVar269;
      fVar169 = (((((float)auVar190._8_4_ * fVar248 + fVar173) - fVar234) * fVar135 + fVar234) -
                fVar110) * fVar269;
      fVar111 = (((((float)auVar190._12_4_ * fVar248 + fVar173) - fVar239) * fVar135 + fVar239) -
                fVar186) * fVar269;
      fVar171 = (((((float)auVar177._0_4_ * fVar248 + fVar173) - fVar222) * fVar135 + fVar222) -
                fVar184) * fVar259;
      fVar184 = (((((float)auVar177._4_4_ * fVar248 + fVar173) - fVar231) * fVar135 + fVar231) -
                fVar185) * fVar259;
      fVar185 = (((((float)auVar177._8_4_ * fVar248 + fVar173) - fVar235) * fVar135 + fVar235) -
                fVar110) * fVar259;
      fVar186 = (((((float)auVar177._12_4_ * fVar248 + fVar173) - fVar240) * fVar135 + fVar240) -
                fVar186) * fVar259;
      uVar194 = ((int)uVar151 < (int)uVar136) * uVar151 | ((int)uVar151 >= (int)uVar136) * uVar136;
      uVar202 = ((int)uVar168 < (int)uVar147) * uVar168 | ((int)uVar168 >= (int)uVar147) * uVar147;
      uVar204 = ((int)uVar170 < (int)uVar148) * uVar170 | ((int)uVar170 >= (int)uVar148) * uVar148;
      uVar205 = ((int)uVar172 < (int)uVar149) * uVar172 | ((int)uVar172 >= (int)uVar149) * uVar149;
      uVar136 = (uint)((int)fVar171 < (int)fVar150) * (int)fVar171 |
                (uint)((int)fVar171 >= (int)fVar150) * (int)fVar150;
      uVar147 = (uint)((int)fVar184 < (int)fVar167) * (int)fVar184 |
                (uint)((int)fVar184 >= (int)fVar167) * (int)fVar167;
      uVar148 = (uint)((int)fVar185 < (int)fVar169) * (int)fVar185 |
                (uint)((int)fVar185 >= (int)fVar169) * (int)fVar169;
      uVar149 = (uint)((int)fVar186 < (int)fVar111) * (int)fVar186 |
                (uint)((int)fVar186 >= (int)fVar111) * (int)fVar111;
      uVar151 = (uint)((int)fVar171 < (int)fVar150) * (int)fVar150 |
                (uint)((int)fVar171 >= (int)fVar150) * (int)fVar171;
      uVar168 = (uint)((int)fVar184 < (int)fVar167) * (int)fVar167 |
                (uint)((int)fVar184 >= (int)fVar167) * (int)fVar184;
      uVar170 = (uint)((int)fVar185 < (int)fVar169) * (int)fVar169 |
                (uint)((int)fVar185 >= (int)fVar169) * (int)fVar185;
      uVar172 = (uint)((int)fVar186 < (int)fVar111) * (int)fVar111 |
                (uint)((int)fVar186 >= (int)fVar111) * (int)fVar186;
      iVar46 = bi_2.field_0._0_4_;
      uVar136 = (uint)((int)uVar136 < iVar46) * iVar46 | ((int)uVar136 >= iVar46) * uVar136;
      iVar46 = bi_2.field_0._4_4_;
      uVar147 = (uint)((int)uVar147 < iVar46) * iVar46 | ((int)uVar147 >= iVar46) * uVar147;
      iVar46 = bi_2.field_0._8_4_;
      uVar148 = (uint)((int)uVar148 < iVar46) * iVar46 | ((int)uVar148 >= iVar46) * uVar148;
      iVar46 = bi_2.field_0._12_4_;
      uVar149 = (uint)((int)uVar149 < iVar46) * iVar46 | ((int)uVar149 >= iVar46) * uVar149;
      dist.field_0.i[0] =
           ((int)uVar136 < (int)uVar55) * uVar55 | ((int)uVar136 >= (int)uVar55) * uVar136;
      dist.field_0.i[1] =
           ((int)uVar147 < (int)uVar131) * uVar131 | ((int)uVar147 >= (int)uVar131) * uVar147;
      dist.field_0.i[2] =
           ((int)uVar148 < (int)uVar133) * uVar133 | ((int)uVar148 >= (int)uVar133) * uVar148;
      dist.field_0.i[3] =
           ((int)uVar149 < (int)uVar134) * uVar134 | ((int)uVar149 >= (int)uVar134) * uVar149;
      bi_5.field_0.i[0] = auVar242._0_4_;
      bi_5.field_0.i[1] = auVar242._4_4_;
      bi_5.field_0.i[2] = auVar242._8_4_;
      bi_5.field_0.i[3] = auVar242._12_4_;
      uVar55 = (uint)(bi_5.field_0.i[0] < (int)uVar151) * bi_5.field_0.i[0] |
               (bi_5.field_0.i[0] >= (int)uVar151) * uVar151;
      uVar131 = (uint)(bi_5.field_0.i[1] < (int)uVar168) * bi_5.field_0.i[1] |
                (bi_5.field_0.i[1] >= (int)uVar168) * uVar168;
      uVar133 = (uint)(bi_5.field_0.i[2] < (int)uVar170) * bi_5.field_0.i[2] |
                (bi_5.field_0.i[2] >= (int)uVar170) * uVar170;
      uVar134 = (uint)(bi_5.field_0.i[3] < (int)uVar172) * bi_5.field_0.i[3] |
                (bi_5.field_0.i[3] >= (int)uVar172) * uVar172;
      auVar177._0_4_ =
           -(uint)((int)(((int)uVar194 < (int)uVar55) * uVar194 |
                        ((int)uVar194 >= (int)uVar55) * uVar55) < dist.field_0.i[0]);
      auVar177._4_4_ =
           -(uint)((int)(((int)uVar202 < (int)uVar131) * uVar202 |
                        ((int)uVar202 >= (int)uVar131) * uVar131) < dist.field_0.i[1]);
      auVar177._8_4_ =
           -(uint)((int)(((int)uVar204 < (int)uVar133) * uVar204 |
                        ((int)uVar204 >= (int)uVar133) * uVar133) < dist.field_0.i[2]);
      auVar177._12_4_ =
           -(uint)((int)(((int)uVar205 < (int)uVar134) * uVar205 |
                        ((int)uVar205 >= (int)uVar134) * uVar134) < dist.field_0.i[3]);
      auVar83 = pmovsxbd(auVar113,auVar113);
      uVar56 = movmskps((int)uVar52,~auVar177 & auVar83);
      local_13a0 = CONCAT44((int)(uVar52 >> 0x20),uVar56);
      lVar49 = lVar49 + uVar48;
      aVar223 = bi_2.field_0;
      while (local_13a0 != 0) {
        lVar59 = 0;
        if (local_13a0 != 0) {
          for (; (local_13a0 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
          }
        }
        local_13a0 = local_13a0 - 1 & local_13a0;
        fVar171 = *(float *)(ray + k * 4 + 0x80);
        if (dist.field_0.v[lVar59] <= fVar171) {
          local_fb8 = ZEXT416((uint)fVar171);
          uVar20 = *(ushort *)(lVar49 + lVar59 * 8);
          uVar21 = *(ushort *)(lVar49 + 2 + lVar59 * 8);
          uVar55 = *(uint *)(lVar49 + 0x88);
          uVar131 = *(uint *)(lVar49 + 4 + lVar59 * 8);
          local_1430 = (ulong)uVar131;
          pGVar24 = (context->scene->geometries).items[uVar55].ptr;
          local_1418 = *(long *)&pGVar24->field_0x58;
          local_1428 = local_1430 *
                       pGVar24[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          fVar186 = pGVar24->fnumTimeSegments;
          fVar184 = (pGVar24->time_range).lower;
          auVar141._0_4_ = (pGVar24->time_range).upper - fVar184;
          auVar116._4_4_ = fVar184;
          auVar116._0_4_ = fVar184;
          auVar116._8_4_ = fVar184;
          auVar116._12_4_ = fVar184;
          auVar180._0_4_ = *(float *)(ray + 0x70) - fVar184;
          auVar180._4_4_ = *(float *)(ray + 0x74) - fVar184;
          auVar180._8_4_ = *(float *)(ray + 0x78) - fVar184;
          auVar180._12_4_ = *(float *)(ray + 0x7c) - fVar184;
          auVar141._4_4_ = auVar141._0_4_;
          auVar141._8_4_ = auVar141._0_4_;
          auVar141._12_4_ = auVar141._0_4_;
          auVar83 = divps(auVar180,auVar141);
          auVar181._0_4_ = auVar83._0_4_ * fVar186;
          auVar181._4_4_ = auVar83._4_4_ * fVar186;
          auVar181._8_4_ = auVar83._8_4_ * fVar186;
          auVar181._12_4_ = auVar83._12_4_ * fVar186;
          auVar83 = roundps(auVar116,auVar181,1);
          auVar84._0_4_ = fVar186 + -1.0;
          auVar84._4_4_ = auVar84._0_4_;
          auVar84._8_4_ = auVar84._0_4_;
          auVar84._12_4_ = auVar84._0_4_;
          auVar83 = minps(auVar83,auVar84);
          auVar83 = maxps(auVar83,_DAT_01f45a50);
          ftime.field_0.v[0] = auVar181._0_4_ - auVar83._0_4_;
          ftime.field_0.v[1] = auVar181._4_4_ - auVar83._4_4_;
          ftime.field_0.v[2] = auVar181._8_4_ - auVar83._8_4_;
          ftime.field_0.v[3] = auVar181._12_4_ - auVar83._12_4_;
          itime.field_0.i[0] = (int)auVar83._0_4_;
          itime.field_0.i[1] = (int)auVar83._4_4_;
          itime.field_0.i[2] = (int)auVar83._8_4_;
          itime.field_0.i[3] = (int)auVar83._12_4_;
          uVar134 = uVar20 & 0x7fff;
          uVar136 = uVar21 & 0x7fff;
          uVar133 = *(uint *)(local_1418 + 4 + local_1428);
          uVar60 = (ulong)uVar133;
          uVar50 = (ulong)(uVar133 * uVar136 + *(int *)(local_1418 + local_1428) + uVar134);
          lVar67 = *(long *)&pGVar24[2].numPrimitives;
          lVar64 = (long)itime.field_0.i[k] * 0x38;
          lVar25 = *(long *)(lVar67 + 0x10 + lVar64);
          lVar61 = *(long *)(lVar67 + lVar64);
          pfVar14 = (float *)(lVar61 + lVar25 * uVar50);
          lVar26 = *(long *)(lVar67 + 0x48 + lVar64);
          pfVar15 = (float *)(lVar61 + (uVar50 + 1) * lVar25);
          lVar59 = uVar50 + uVar60;
          pfVar1 = (float *)(lVar61 + lVar59 * lVar25);
          lVar68 = uVar50 + uVar60 + 1;
          pfVar2 = (float *)(lVar61 + lVar68 * lVar25);
          uVar52 = (ulong)(-1 < (short)uVar20);
          lVar51 = uVar50 + uVar52 + 1;
          pfVar3 = (float *)(lVar61 + lVar51 * lVar25);
          lVar58 = uVar52 + lVar68;
          pfVar4 = (float *)(lVar61 + lVar58 * lVar25);
          uVar52 = 0;
          if (-1 < (short)uVar21) {
            uVar52 = uVar60;
          }
          pfVar5 = (float *)(lVar61 + (lVar59 + uVar52) * lVar25);
          pfVar6 = (float *)(lVar61 + (lVar68 + uVar52) * lVar25);
          lVar61 = lVar61 + lVar25 * (uVar52 + lVar58);
          fVar150 = *(float *)(lVar61 + 4);
          fVar184 = *(float *)(lVar61 + 8);
          lVar61 = *(long *)(lVar67 + 0x38 + lVar64);
          pfVar7 = (float *)(lVar61 + lVar26 * uVar50);
          pfVar8 = (float *)(lVar61 + lVar26 * (uVar50 + 1));
          pfVar9 = (float *)(lVar61 + lVar26 * lVar59);
          pfVar10 = (float *)(lVar61 + lVar26 * lVar68);
          pfVar11 = (float *)(lVar61 + lVar26 * lVar51);
          pfVar12 = (float *)(lVar61 + lVar26 * lVar58);
          fVar186 = *(float *)((long)&stack[-1].ptr.ptr + k * 4);
          pfVar13 = (float *)(lVar61 + lVar26 * (lVar59 + uVar52));
          fVar214 = (*pfVar8 - *pfVar15) * fVar186 + *pfVar15;
          local_1098 = (pfVar8[1] - pfVar15[1]) * fVar186 + pfVar15[1];
          local_1088 = (pfVar8[2] - pfVar15[2]) * fVar186 + pfVar15[2];
          pfVar15 = (float *)(lVar61 + lVar26 * (lVar68 + uVar52));
          fVar222 = (*pfVar9 - *pfVar1) * fVar186 + *pfVar1;
          local_10a8 = (pfVar9[1] - pfVar1[1]) * fVar186 + pfVar1[1];
          fVar130 = (pfVar9[2] - pfVar1[2]) * fVar186 + pfVar1[2];
          lVar61 = lVar61 + (uVar52 + lVar58) * lVar26;
          fVar167 = *(float *)(lVar61 + 4);
          fVar173 = (*pfVar10 - *pfVar2) * fVar186 + *pfVar2;
          fVar206 = (pfVar10[1] - pfVar2[1]) * fVar186 + pfVar2[1];
          fStack_107c = (pfVar10[2] - pfVar2[2]) * fVar186 + pfVar2[2];
          fStack_1094 = (pfVar11[1] - pfVar3[1]) * fVar186 + pfVar3[1];
          fStack_1084 = (pfVar11[2] - pfVar3[2]) * fVar186 + pfVar3[2];
          fVar231 = (*pfVar12 - *pfVar4) * fVar186 + *pfVar4;
          fVar217 = (pfVar12[1] - pfVar4[1]) * fVar186 + pfVar4[1];
          fStack_1080 = (pfVar12[2] - pfVar4[2]) * fVar186 + pfVar4[2];
          fVar169 = (*pfVar13 - *pfVar5) * fVar186 + *pfVar5;
          fStack_109c = (pfVar13[1] - pfVar5[1]) * fVar186 + pfVar5[1];
          fStack_1064 = (pfVar13[2] - pfVar5[2]) * fVar186 + pfVar5[2];
          fVar187 = (*pfVar15 - *pfVar6) * fVar186 + *pfVar6;
          fVar201 = (pfVar15[1] - pfVar6[1]) * fVar186 + pfVar6[1];
          local_1068 = (pfVar15[2] - pfVar6[2]) * fVar186 + pfVar6[2];
          local_1268 = CONCAT44(local_1068,(*(float *)(lVar61 + 8) - fVar184) * fVar186 + fVar184);
          fVar184 = *(float *)(ray + k * 4);
          fVar185 = *(float *)(ray + k * 4 + 0x10);
          local_fc8 = ((*pfVar7 - *pfVar14) * fVar186 + *pfVar14) - fVar184;
          fStack_fc4 = fVar214 - fVar184;
          fStack_fc0 = fVar173 - fVar184;
          fStack_fbc = fVar222 - fVar184;
          fVar214 = fVar214 - fVar184;
          fVar216 = ((*pfVar11 - *pfVar3) * fVar186 + *pfVar3) - fVar184;
          fVar219 = fVar231 - fVar184;
          fVar220 = fVar173 - fVar184;
          fVar111 = fVar222 - fVar184;
          fVar132 = fVar173 - fVar184;
          fVar238 = fVar187 - fVar184;
          fVar184 = fVar169 - fVar184;
          fVar110 = *(float *)(ray + k * 4 + 0x20);
          local_fd8 = ((pfVar7[1] - pfVar14[1]) * fVar186 + pfVar14[1]) - fVar185;
          fStack_fd4 = local_1098 - fVar185;
          fStack_fd0 = fVar206 - fVar185;
          fStack_fcc = local_10a8 - fVar185;
          local_1008 = ((pfVar7[2] - pfVar14[2]) * fVar186 + pfVar14[2]) - fVar110;
          fStack_1004 = local_1088 - fVar110;
          fStack_1000 = fStack_107c - fVar110;
          fStack_ffc = fVar130 - fVar110;
          fStack_10a4 = fVar206;
          fStack_10a0 = fVar201;
          local_1468 = local_10a8 - fVar185;
          fStack_1464 = fVar206 - fVar185;
          fStack_1460 = fVar201 - fVar185;
          fStack_145c = fStack_109c - fVar185;
          local_1078 = CONCAT44(fStack_107c,fVar130);
          fVar130 = fVar130 - fVar110;
          fVar262 = fStack_107c - fVar110;
          fVar218 = local_1068 - fVar110;
          fVar240 = fStack_1064 - fVar110;
          local_fe8 = fVar111 - local_fc8;
          fStack_fe4 = fVar132 - fStack_fc4;
          fStack_fe0 = fVar238 - fStack_fc0;
          fStack_fdc = fVar184 - fStack_fbc;
          local_1018 = local_1468 - local_fd8;
          fStack_1014 = fStack_1464 - fStack_fd4;
          fStack_1010 = fStack_1460 - fStack_fd0;
          fStack_100c = fStack_145c - fStack_fcc;
          local_ff8 = fVar130 - local_1008;
          fStack_ff4 = fVar262 - fStack_1004;
          fStack_ff0 = fVar218 - fStack_1000;
          fStack_fec = fVar240 - fStack_ffc;
          local_14d8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
          local_14d8._0_4_ = local_14d8._4_4_;
          fStack_14d0 = (float)local_14d8._4_4_;
          fStack_14cc = (float)local_14d8._4_4_;
          local_14e8._4_4_ = *(float *)(ray + k * 4 + 0x60);
          fStack_147c = *(float *)(ray + k * 4 + 0x40);
          fVar221 = (local_1018 * (fVar130 + local_1008) - (local_1468 + local_fd8) * local_ff8) *
                    fStack_147c +
                    ((fVar111 + local_fc8) * local_ff8 - (fVar130 + local_1008) * local_fe8) *
                    (float)local_14d8._4_4_ +
                    (local_fe8 * (local_1468 + local_fd8) - (fVar111 + local_fc8) * local_1018) *
                    local_14e8._4_4_;
          fVar228 = (fStack_1014 * (fVar262 + fStack_1004) - (fStack_1464 + fStack_fd4) * fStack_ff4
                    ) * fStack_147c +
                    ((fVar132 + fStack_fc4) * fStack_ff4 - (fVar262 + fStack_1004) * fStack_fe4) *
                    (float)local_14d8._4_4_ +
                    (fStack_fe4 * (fStack_1464 + fStack_fd4) - (fVar132 + fStack_fc4) * fStack_1014)
                    * local_14e8._4_4_;
          uVar195 = CONCAT44(fVar228,fVar221);
          fVar229 = (fStack_1010 * (fVar218 + fStack_1000) - (fStack_1460 + fStack_fd0) * fStack_ff0
                    ) * fStack_147c +
                    ((fVar238 + fStack_fc0) * fStack_ff0 - (fVar218 + fStack_1000) * fStack_fe0) *
                    (float)local_14d8._4_4_ +
                    (fStack_fe0 * (fStack_1460 + fStack_fd0) - (fVar238 + fStack_fc0) * fStack_1010)
                    * local_14e8._4_4_;
          fVar230 = (fStack_100c * (fVar240 + fStack_ffc) - (fStack_145c + fStack_fcc) * fStack_fec)
                    * fStack_147c +
                    ((fVar184 + fStack_fbc) * fStack_fec - (fVar240 + fStack_ffc) * fStack_fdc) *
                    (float)local_14d8._4_4_ +
                    (fStack_fdc * (fStack_145c + fStack_fcc) - (fVar184 + fStack_fbc) * fStack_100c)
                    * local_14e8._4_4_;
          fStack_1090 = fVar217;
          fStack_108c = fVar206;
          fVar203 = local_1098 - fVar185;
          fVar246 = fStack_1094 - fVar185;
          fVar247 = fVar217 - fVar185;
          fVar248 = fVar206 - fVar185;
          fVar255 = local_1088 - fVar110;
          fVar256 = fStack_1084 - fVar110;
          fVar257 = fStack_1080 - fVar110;
          fVar258 = fStack_107c - fVar110;
          fVar237 = local_fc8 - fVar214;
          fVar239 = fStack_fc4 - fVar216;
          fVar236 = fStack_fc0 - fVar219;
          fVar241 = fStack_fbc - fVar220;
          fVar263 = local_fd8 - fVar203;
          fVar266 = fStack_fd4 - fVar246;
          fVar267 = fStack_fd0 - fVar247;
          fVar268 = fStack_fcc - fVar248;
          local_1028 = local_1008 - fVar255;
          fStack_1024 = fStack_1004 - fVar256;
          fStack_1020 = fStack_1000 - fVar257;
          fStack_101c = fStack_ffc - fVar258;
          auVar260._0_4_ =
               (fVar263 * (local_1008 + fVar255) - (local_fd8 + fVar203) * local_1028) * fStack_147c
               + ((local_fc8 + fVar214) * local_1028 - (local_1008 + fVar255) * fVar237) *
                 (float)local_14d8._4_4_ +
                 (fVar237 * (local_fd8 + fVar203) - (local_fc8 + fVar214) * fVar263) *
                 local_14e8._4_4_;
          auVar260._4_4_ =
               (fVar266 * (fStack_1004 + fVar256) - (fStack_fd4 + fVar246) * fStack_1024) *
               fStack_147c +
               ((fStack_fc4 + fVar216) * fStack_1024 - (fStack_1004 + fVar256) * fVar239) *
               (float)local_14d8._4_4_ +
               (fVar239 * (fStack_fd4 + fVar246) - (fStack_fc4 + fVar216) * fVar266) *
               local_14e8._4_4_;
          auVar260._8_4_ =
               (fVar267 * (fStack_1000 + fVar257) - (fStack_fd0 + fVar247) * fStack_1020) *
               fStack_147c +
               ((fStack_fc0 + fVar219) * fStack_1020 - (fStack_1000 + fVar257) * fVar236) *
               (float)local_14d8._4_4_ +
               (fVar236 * (fStack_fd0 + fVar247) - (fStack_fc0 + fVar219) * fVar267) *
               local_14e8._4_4_;
          auVar260._12_4_ =
               (fVar268 * (fStack_ffc + fVar258) - (fStack_fcc + fVar248) * fStack_101c) *
               fStack_147c +
               ((fStack_fbc + fVar220) * fStack_101c - (fStack_ffc + fVar258) * fVar241) *
               (float)local_14d8._4_4_ +
               (fVar241 * (fStack_fcc + fVar248) - (fStack_fbc + fVar220) * fVar268) *
               local_14e8._4_4_;
          fVar232 = fVar214 - fVar111;
          fVar233 = fVar216 - fVar132;
          fVar234 = fVar219 - fVar238;
          fVar235 = fVar220 - fVar184;
          fVar271 = fVar203 - local_1468;
          fVar272 = fVar246 - fStack_1464;
          fVar273 = fVar247 - fStack_1460;
          fVar274 = fVar248 - fStack_145c;
          fVar135 = fVar255 - fVar130;
          fVar213 = fVar256 - fVar262;
          fVar215 = fVar257 - fVar218;
          fVar207 = fVar258 - fVar240;
          local_1398 = fVar203 + local_1468;
          fStack_1394 = fVar246 + fStack_1464;
          fStack_1390 = fVar247 + fStack_1460;
          fStack_138c = fVar248 + fStack_145c;
          local_1388 = fVar255 + fVar130;
          fStack_1384 = fVar256 + fVar262;
          fStack_1380 = fVar257 + fVar218;
          fStack_137c = fVar258 + fVar240;
          local_14e8._0_4_ = local_14e8._4_4_;
          uStack_14e0._0_4_ = local_14e8._4_4_;
          uStack_14e0._4_4_ = local_14e8._4_4_;
          auVar117._0_4_ =
               (fVar271 * local_1388 - local_1398 * fVar135) * fStack_147c +
               ((fVar111 + fVar214) * fVar135 - fVar232 * local_1388) * (float)local_14d8._4_4_ +
               (fVar232 * local_1398 - (fVar111 + fVar214) * fVar271) * local_14e8._4_4_;
          auVar117._4_4_ =
               (fVar272 * fStack_1384 - fStack_1394 * fVar213) * fStack_147c +
               ((fVar132 + fVar216) * fVar213 - fVar233 * fStack_1384) * (float)local_14d8._4_4_ +
               (fVar233 * fStack_1394 - (fVar132 + fVar216) * fVar272) * local_14e8._4_4_;
          auVar117._8_4_ =
               (fVar273 * fStack_1380 - fStack_1390 * fVar215) * fStack_147c +
               ((fVar238 + fVar219) * fVar215 - fVar234 * fStack_1380) * (float)local_14d8._4_4_ +
               (fVar234 * fStack_1390 - (fVar238 + fVar219) * fVar273) * local_14e8._4_4_;
          auVar117._12_4_ =
               (fVar274 * fStack_137c - fStack_138c * fVar207) * fStack_147c +
               ((fVar184 + fVar220) * fVar207 - fVar235 * fStack_137c) * (float)local_14d8._4_4_ +
               (fVar235 * fStack_138c - (fVar184 + fVar220) * fVar274) * local_14e8._4_4_;
          fVar214 = fVar221 + auVar260._0_4_ + auVar117._0_4_;
          fVar216 = fVar228 + auVar260._4_4_ + auVar117._4_4_;
          fVar219 = fVar229 + auVar260._8_4_ + auVar117._8_4_;
          fVar220 = fVar230 + auVar260._12_4_ + auVar117._12_4_;
          auVar85._8_4_ = fVar229;
          auVar85._0_8_ = uVar195;
          auVar85._12_4_ = fVar230;
          auVar83 = minps(auVar85,auVar260);
          auVar83 = minps(auVar83,auVar117);
          local_1048._8_4_ = fVar229;
          local_1048._0_8_ = uVar195;
          local_1048._12_4_ = fVar230;
          auVar250._8_4_ = fVar229;
          auVar250._0_8_ = uVar195;
          auVar250._12_4_ = fVar230;
          auVar113 = maxps(auVar250,auVar260);
          auVar113 = maxps(auVar113,auVar117);
          fVar184 = ABS(fVar214);
          fVar111 = ABS(fVar216);
          fVar132 = ABS(fVar219);
          fVar238 = ABS(fVar220);
          auVar251._4_4_ = -(uint)(auVar113._4_4_ <= fVar111 * 1.1920929e-07);
          auVar251._0_4_ = -(uint)(auVar113._0_4_ <= fVar184 * 1.1920929e-07);
          auVar251._8_4_ = -(uint)(auVar113._8_4_ <= fVar132 * 1.1920929e-07);
          auVar251._12_4_ = -(uint)(auVar113._12_4_ <= fVar238 * 1.1920929e-07);
          auVar86._4_4_ = -(uint)(-(fVar111 * 1.1920929e-07) <= auVar83._4_4_);
          auVar86._0_4_ = -(uint)(-(fVar184 * 1.1920929e-07) <= auVar83._0_4_);
          auVar86._8_4_ = -(uint)(-(fVar132 * 1.1920929e-07) <= auVar83._8_4_);
          auVar86._12_4_ = -(uint)(-(fVar238 * 1.1920929e-07) <= auVar83._12_4_);
          auVar251 = auVar251 | auVar86;
          iVar46 = movmskps((int)(lVar26 * lVar58),auVar251);
          lVar59 = local_1418;
          lVar61 = local_1428;
          if (iVar46 == 0) {
            uVar133 = 0;
          }
          else {
            local_1058 = fVar214;
            fStack_1054 = fVar216;
            fStack_1050 = fVar219;
            fStack_104c = fVar220;
            local_1068 = fVar184;
            fStack_1064 = fVar111;
            fStack_1060 = fVar132;
            fStack_105c = fVar238;
            local_1038 = fVar271;
            fStack_1034 = fVar272;
            fStack_1030 = fVar273;
            fStack_102c = fVar274;
            auVar264._0_4_ = fVar263 * fVar135 - fVar271 * local_1028;
            auVar264._4_4_ = fVar266 * fVar213 - fVar272 * fStack_1024;
            auVar264._8_4_ = fVar267 * fVar215 - fVar273 * fStack_1020;
            auVar264._12_4_ = fVar268 * fVar207 - fVar274 * fStack_101c;
            auVar87._4_4_ = -(uint)(ABS(fVar266 * fStack_ff4) < ABS(fVar272 * fStack_1024));
            auVar87._0_4_ = -(uint)(ABS(fVar263 * local_ff8) < ABS(fVar271 * local_1028));
            auVar87._8_4_ = -(uint)(ABS(fVar267 * fStack_ff0) < ABS(fVar273 * fStack_1020));
            auVar87._12_4_ = -(uint)(ABS(fVar268 * fStack_fec) < ABS(fVar274 * fStack_101c));
            auVar39._4_4_ = fStack_1014 * fStack_1024 - fVar266 * fStack_ff4;
            auVar39._0_4_ = local_1018 * local_1028 - fVar263 * local_ff8;
            auVar39._8_4_ = fStack_1010 * fStack_1020 - fVar267 * fStack_ff0;
            auVar39._12_4_ = fStack_100c * fStack_101c - fVar268 * fStack_fec;
            local_12d8 = blendvps(auVar264,auVar39,auVar87);
            auVar211._0_4_ = fVar232 * local_1028 - fVar237 * fVar135;
            auVar211._4_4_ = fVar233 * fStack_1024 - fVar239 * fVar213;
            auVar211._8_4_ = fVar234 * fStack_1020 - fVar236 * fVar215;
            auVar211._12_4_ = fVar235 * fStack_101c - fVar241 * fVar207;
            auVar88._4_4_ = -(uint)(ABS(fStack_fe4 * fStack_1024) < ABS(fVar239 * fVar213));
            auVar88._0_4_ = -(uint)(ABS(local_fe8 * local_1028) < ABS(fVar237 * fVar135));
            auVar88._8_4_ = -(uint)(ABS(fStack_fe0 * fStack_1020) < ABS(fVar236 * fVar215));
            auVar88._12_4_ = -(uint)(ABS(fStack_fdc * fStack_101c) < ABS(fVar241 * fVar207));
            auVar40._4_4_ = fStack_ff4 * fVar239 - fStack_fe4 * fStack_1024;
            auVar40._0_4_ = local_ff8 * fVar237 - local_fe8 * local_1028;
            auVar40._8_4_ = fStack_ff0 * fVar236 - fStack_fe0 * fStack_1020;
            auVar40._12_4_ = fStack_fec * fVar241 - fStack_fdc * fStack_101c;
            local_12c8 = blendvps(auVar211,auVar40,auVar88);
            auVar197._0_4_ = local_fe8 * fVar263 - fVar237 * local_1018;
            auVar197._4_4_ = fStack_fe4 * fVar266 - fVar239 * fStack_1014;
            auVar197._8_4_ = fStack_fe0 * fVar267 - fVar236 * fStack_1010;
            auVar197._12_4_ = fStack_fdc * fVar268 - fVar241 * fStack_100c;
            auVar225._0_4_ = fVar237 * fVar271 - fVar232 * fVar263;
            auVar225._4_4_ = fVar239 * fVar272 - fVar233 * fVar266;
            auVar225._8_4_ = fVar236 * fVar273 - fVar234 * fVar267;
            auVar225._12_4_ = fVar241 * fVar274 - fVar235 * fVar268;
            auVar89._4_4_ = -(uint)(ABS(fVar239 * fStack_1014) < ABS(fVar233 * fVar266));
            auVar89._0_4_ = -(uint)(ABS(fVar237 * local_1018) < ABS(fVar232 * fVar263));
            auVar89._8_4_ = -(uint)(ABS(fVar236 * fStack_1010) < ABS(fVar234 * fVar267));
            auVar89._12_4_ = -(uint)(ABS(fVar241 * fStack_100c) < ABS(fVar235 * fVar268));
            local_12b8 = blendvps(auVar225,auVar197,auVar89);
            fVar237 = local_12c8._4_4_;
            fVar239 = local_12c8._8_4_;
            fVar236 = local_12c8._12_4_;
            fVar135 = fStack_147c * local_12d8._0_4_ +
                      (float)local_14d8._4_4_ * local_12c8._0_4_ +
                      local_14e8._4_4_ * local_12b8._0_4_;
            fVar213 = fStack_147c * local_12d8._4_4_ +
                      (float)local_14d8._4_4_ * fVar237 + local_14e8._4_4_ * local_12b8._4_4_;
            fVar215 = fStack_147c * local_12d8._8_4_ +
                      (float)local_14d8._4_4_ * fVar239 + local_14e8._4_4_ * local_12b8._8_4_;
            fVar207 = fStack_147c * local_12d8._12_4_ +
                      (float)local_14d8._4_4_ * fVar236 + local_14e8._4_4_ * local_12b8._12_4_;
            auVar142._0_4_ = fVar135 + fVar135;
            auVar142._4_4_ = fVar213 + fVar213;
            auVar142._8_4_ = fVar215 + fVar215;
            auVar142._12_4_ = fVar207 + fVar207;
            auVar90._0_4_ = local_fd8 * local_12c8._0_4_ + local_1008 * local_12b8._0_4_;
            auVar90._4_4_ = fStack_fd4 * fVar237 + fStack_1004 * local_12b8._4_4_;
            auVar90._8_4_ = fStack_fd0 * fVar239 + fStack_1000 * local_12b8._8_4_;
            auVar90._12_4_ = fStack_fcc * fVar236 + fStack_ffc * local_12b8._12_4_;
            fVar232 = local_fc8 * local_12d8._0_4_ + auVar90._0_4_;
            fVar233 = fStack_fc4 * local_12d8._4_4_ + auVar90._4_4_;
            fVar234 = fStack_fc0 * local_12d8._8_4_ + auVar90._8_4_;
            fVar235 = fStack_fbc * local_12d8._12_4_ + auVar90._12_4_;
            auVar83 = rcpps(auVar90,auVar142);
            fVar135 = auVar83._0_4_;
            fVar213 = auVar83._4_4_;
            fVar215 = auVar83._8_4_;
            fVar207 = auVar83._12_4_;
            auVar118._0_4_ =
                 ((1.0 - auVar142._0_4_ * fVar135) * fVar135 + fVar135) * (fVar232 + fVar232);
            auVar118._4_4_ =
                 ((1.0 - auVar142._4_4_ * fVar213) * fVar213 + fVar213) * (fVar233 + fVar233);
            auVar118._8_4_ =
                 ((1.0 - auVar142._8_4_ * fVar215) * fVar215 + fVar215) * (fVar234 + fVar234);
            auVar118._12_4_ =
                 ((1.0 - auVar142._12_4_ * fVar207) * fVar207 + fVar207) * (fVar235 + fVar235);
            fVar135 = *(float *)(ray + k * 4 + 0x30);
            iVar70 = -(uint)(fVar135 <= auVar118._4_4_);
            iVar71 = -(uint)(fVar135 <= auVar118._8_4_);
            iVar72 = -(uint)(fVar135 <= auVar118._12_4_);
            auVar158._8_4_ = iVar71;
            auVar158._4_4_ = iVar70;
            auVar158._12_4_ = iVar72;
            auVar91._0_4_ =
                 -(uint)(auVar118._0_4_ <= fVar171 && fVar135 <= auVar118._0_4_) & auVar251._0_4_;
            auVar91._4_4_ =
                 -(uint)(auVar118._4_4_ <= fVar171 && fVar135 <= auVar118._4_4_) & auVar251._4_4_;
            auVar91._8_4_ =
                 -(uint)(auVar118._8_4_ <= fVar171 && fVar135 <= auVar118._8_4_) & auVar251._8_4_;
            auVar91._12_4_ =
                 -(uint)(auVar118._12_4_ <= fVar171 && fVar135 <= auVar118._12_4_) & auVar251._12_4_
            ;
            uVar133 = movmskps(iVar46,auVar91);
            if (uVar133 != 0) {
              valid.field_0.i[0] = auVar91._0_4_ & -(uint)(auVar142._0_4_ != 0.0);
              valid.field_0.i[1] = auVar91._4_4_ & -(uint)(auVar142._4_4_ != 0.0);
              valid.field_0.i[2] = auVar91._8_4_ & -(uint)(auVar142._8_4_ != 0.0);
              valid.field_0.i[3] = auVar91._12_4_ & -(uint)(auVar142._12_4_ != 0.0);
              uVar133 = movmskps(uVar133,(undefined1  [16])valid.field_0);
              if (uVar133 != 0) {
                auVar43._4_4_ = fVar216;
                auVar43._0_4_ = fVar214;
                auVar43._8_4_ = fVar219;
                auVar43._12_4_ = fVar220;
                local_12e8 = auVar118;
                auVar158._0_4_ = (float)(int)(*(ushort *)(local_1418 + 8 + local_1428) - 1);
                auVar198._4_4_ = iVar70;
                auVar198._0_4_ = auVar158._0_4_;
                auVar198._8_4_ = iVar71;
                auVar198._12_4_ = iVar72;
                auVar83 = rcpss(auVar198,auVar158);
                auVar212._4_12_ = local_12c8._4_12_;
                auVar212._0_4_ = (float)(int)(*(ushort *)(local_1418 + 10 + local_1428) - 1);
                fVar171 = (2.0 - auVar158._0_4_ * auVar83._0_4_) * auVar83._0_4_;
                auVar199._4_4_ = fVar237;
                auVar199._0_4_ = auVar212._0_4_;
                auVar199._8_4_ = fVar239;
                auVar199._12_4_ = fVar236;
                auVar83 = rcpss(auVar199,auVar212);
                fVar135 = (2.0 - auVar212._0_4_ * auVar83._0_4_) * auVar83._0_4_;
                tNear.field_0.v[0] = fVar171 * (fVar221 + (float)uVar134 * fVar214);
                tNear.field_0.v[1] = fVar171 * (fVar228 + (float)(uVar134 + 1) * fVar216);
                tNear.field_0.v[2] = fVar171 * (fVar229 + (float)(uVar134 + 1) * fVar219);
                tNear.field_0.v[3] = fVar171 * (fVar230 + (float)uVar134 * fVar220);
                auVar182._0_4_ = (float)uVar136 * fVar214 + auVar260._0_4_;
                auVar182._4_4_ = (float)uVar136 * fVar216 + auVar260._4_4_;
                auVar182._8_4_ = (float)(uVar136 + 1) * fVar219 + auVar260._8_4_;
                auVar182._12_4_ = (float)(uVar136 + 1) * fVar220 + auVar260._12_4_;
                pGVar24 = (context->scene->geometries).items[uVar55].ptr;
                uVar133 = *(uint *)(ray + k * 4 + 0x90);
                if ((pGVar24->mask & uVar133) != 0) {
                  auVar83 = rcpps(auVar182,auVar43);
                  fVar171 = auVar83._0_4_;
                  fVar213 = auVar83._4_4_;
                  fVar215 = auVar83._8_4_;
                  fVar207 = auVar83._12_4_;
                  fVar171 = (float)(-(uint)(1e-18 <= fVar184) &
                                   (uint)(((float)DAT_01f46a60 - fVar214 * fVar171) * fVar171 +
                                         fVar171));
                  fVar184 = (float)(-(uint)(1e-18 <= fVar111) &
                                   (uint)((DAT_01f46a60._4_4_ - fVar216 * fVar213) * fVar213 +
                                         fVar213));
                  fVar111 = (float)(-(uint)(1e-18 <= fVar132) &
                                   (uint)((DAT_01f46a60._8_4_ - fVar219 * fVar215) * fVar215 +
                                         fVar215));
                  fVar132 = (float)(-(uint)(1e-18 <= fVar238) &
                                   (uint)((DAT_01f46a60._12_4_ - fVar220 * fVar207) * fVar207 +
                                         fVar207));
                  auVar143._0_4_ = tNear.field_0.v[0] * fVar171;
                  auVar143._4_4_ = tNear.field_0.v[1] * fVar184;
                  auVar143._8_4_ = tNear.field_0.v[2] * fVar111;
                  auVar143._12_4_ = tNear.field_0.v[3] * fVar132;
                  local_1308 = minps(auVar143,_DAT_01f46a60);
                  auVar159._0_4_ = fVar135 * auVar182._0_4_ * fVar171;
                  auVar159._4_4_ = fVar135 * auVar182._4_4_ * fVar184;
                  auVar159._8_4_ = fVar135 * auVar182._8_4_ * fVar111;
                  auVar159._12_4_ = fVar135 * auVar182._12_4_ * fVar132;
                  local_12f8 = minps(auVar159,_DAT_01f46a60);
                  auVar113 = blendvps(_DAT_01f45a30,auVar118,(undefined1  [16])valid.field_0);
                  auVar160._4_4_ = auVar113._0_4_;
                  auVar160._0_4_ = auVar113._4_4_;
                  auVar160._8_4_ = auVar113._12_4_;
                  auVar160._12_4_ = auVar113._8_4_;
                  auVar83 = minps(auVar160,auVar113);
                  auVar119._0_8_ = auVar83._8_8_;
                  auVar119._8_4_ = auVar83._0_4_;
                  auVar119._12_4_ = auVar83._4_4_;
                  auVar83 = minps(auVar119,auVar83);
                  uVar151 = -(uint)(auVar83._0_4_ == auVar113._0_4_);
                  uVar168 = -(uint)(auVar83._4_4_ == auVar113._4_4_);
                  uVar170 = -(uint)(auVar83._8_4_ == auVar113._8_4_);
                  uVar172 = -(uint)(auVar83._12_4_ == auVar113._12_4_);
                  auVar144._0_4_ = uVar151 & valid.field_0.i[0];
                  auVar144._4_4_ = uVar168 & valid.field_0.i[1];
                  auVar144._8_4_ = uVar170 & valid.field_0.i[2];
                  auVar144._12_4_ = uVar172 & valid.field_0.i[3];
                  iVar46 = movmskps(uVar133,auVar144);
                  uVar133 = 0xffffffff;
                  uVar147 = 0xffffffff;
                  uVar148 = 0xffffffff;
                  uVar149 = 0xffffffff;
                  if (iVar46 != 0) {
                    uVar133 = uVar151;
                    uVar147 = uVar168;
                    uVar148 = uVar170;
                    uVar149 = uVar172;
                  }
                  auVar92._0_4_ = valid.field_0.i[0] & uVar133;
                  auVar92._4_4_ = valid.field_0.i[1] & uVar147;
                  auVar92._8_4_ = valid.field_0.i[2] & uVar148;
                  auVar92._12_4_ = valid.field_0.i[3] & uVar149;
                  uVar133 = movmskps(iVar46,auVar92);
                  lVar67 = 0;
                  if (uVar133 != 0) {
                    for (; (uVar133 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar24->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar56 = *(undefined4 *)(local_1308 + lVar67 * 4);
                    uVar16 = *(undefined4 *)(local_12f8 + lVar67 * 4);
                    uVar17 = *(undefined4 *)(local_12d8 + lVar67 * 4);
                    uVar18 = *(undefined4 *)(local_12c8 + lVar67 * 4);
                    uVar19 = *(undefined4 *)(local_12b8 + lVar67 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12e8 + lVar67 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar17;
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar18;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar19;
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar56;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar16;
                    *(uint *)(ray + k * 4 + 0x110) = uVar131;
                    *(uint *)(ray + k * 4 + 0x120) = uVar55;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    uVar133 = context->user->instPrimID[0];
                    *(uint *)(ray + k * 4 + 0x140) = uVar133;
                  }
                  else {
                    local_14e8 = CONCAT44(uVar55,uVar55);
                    uStack_14e0._0_4_ = uVar55;
                    uStack_14e0._4_4_ = uVar55;
                    auVar44 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar47);
                    fStack_145c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar47 + 8) >>
                                         0x20);
                    _local_14d8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    while( true ) {
                      local_1148 = *(undefined4 *)(local_1308 + lVar67 * 4);
                      local_1138._4_4_ = *(undefined4 *)(local_12f8 + lVar67 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12e8 + lVar67 * 4)
                      ;
                      args.context = context->user;
                      local_1178 = *(undefined4 *)(local_12d8 + lVar67 * 4);
                      local_1168._4_4_ = *(undefined4 *)(local_12c8 + lVar67 * 4);
                      local_1158._4_4_ = *(undefined4 *)(local_12b8 + lVar67 * 4);
                      uStack_1174 = local_1178;
                      uStack_1170 = local_1178;
                      uStack_116c = local_1178;
                      local_1168._0_4_ = local_1168._4_4_;
                      local_1168._8_4_ = local_1168._4_4_;
                      local_1168._12_4_ = local_1168._4_4_;
                      local_1158._0_4_ = local_1158._4_4_;
                      local_1158._8_4_ = local_1158._4_4_;
                      local_1158._12_4_ = local_1158._4_4_;
                      uStack_1144 = local_1148;
                      uStack_1140 = local_1148;
                      uStack_113c = local_1148;
                      local_1138._0_4_ = local_1138._4_4_;
                      local_1138._8_4_ = local_1138._4_4_;
                      local_1138._12_4_ = local_1138._4_4_;
                      local_1128 = CONCAT44(uVar131,uVar131);
                      uStack_1120 = CONCAT44(uVar131,uVar131);
                      local_1118 = local_14e8;
                      uStack_1110 = uStack_14e0;
                      local_1108 = (args.context)->instID[0];
                      uStack_1104 = local_1108;
                      uStack_1100 = local_1108;
                      uStack_10fc = local_1108;
                      local_10f8 = (args.context)->instPrimID[0];
                      uStack_10f4 = local_10f8;
                      uStack_10f0 = local_10f8;
                      uStack_10ec = local_10f8;
                      local_1448._12_4_ = fStack_145c;
                      local_1448._0_12_ = auVar44;
                      args.valid = (int *)local_1448;
                      args.geometryUserPtr = pGVar24->userPtr;
                      args.hit = (RTCHitN *)&local_1178;
                      args.N = 4;
                      pRVar53 = (RTCRayN *)pGVar24->intersectionFilterN;
                      args.ray = (RTCRayN *)ray;
                      if (pRVar53 != (RTCRayN *)0x0) {
                        pRVar53 = (RTCRayN *)(*(code *)pRVar53)(&args);
                      }
                      if (local_1448 == (undefined1  [16])0x0) {
                        auVar120._8_4_ = 0xffffffff;
                        auVar120._0_8_ = 0xffffffffffffffff;
                        auVar120._12_4_ = 0xffffffff;
                        auVar120 = auVar120 ^ _DAT_01f46b70;
                      }
                      else {
                        pRVar53 = (RTCRayN *)context->args->filter;
                        if ((pRVar53 != (RTCRayN *)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                          pRVar53 = (RTCRayN *)(*(code *)pRVar53)(&args);
                        }
                        auVar93._0_4_ = -(uint)(local_1448._0_4_ == 0);
                        auVar93._4_4_ = -(uint)(local_1448._4_4_ == 0);
                        auVar93._8_4_ = -(uint)(local_1448._8_4_ == 0);
                        auVar93._12_4_ = -(uint)(local_1448._12_4_ == 0);
                        auVar120 = auVar93 ^ _DAT_01f46b70;
                        if (local_1448 != (undefined1  [16])0x0) {
                          auVar83 = blendvps(*(undefined1 (*) [16])args.hit,
                                             *(undefined1 (*) [16])(args.ray + 0xc0),auVar93);
                          *(undefined1 (*) [16])(args.ray + 0xc0) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                             *(undefined1 (*) [16])(args.ray + 0xd0),auVar93);
                          *(undefined1 (*) [16])(args.ray + 0xd0) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                             *(undefined1 (*) [16])(args.ray + 0xe0),auVar93);
                          *(undefined1 (*) [16])(args.ray + 0xe0) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                             *(undefined1 (*) [16])(args.ray + 0xf0),auVar93);
                          *(undefined1 (*) [16])(args.ray + 0xf0) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                             *(undefined1 (*) [16])(args.ray + 0x100),auVar93);
                          *(undefined1 (*) [16])(args.ray + 0x100) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                             *(undefined1 (*) [16])(args.ray + 0x110),auVar93);
                          *(undefined1 (*) [16])(args.ray + 0x110) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                             *(undefined1 (*) [16])(args.ray + 0x120),auVar93);
                          *(undefined1 (*) [16])(args.ray + 0x120) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                             *(undefined1 (*) [16])(args.ray + 0x130),auVar93);
                          *(undefined1 (*) [16])(args.ray + 0x130) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                             *(undefined1 (*) [16])(args.ray + 0x140),auVar93);
                          *(undefined1 (*) [16])(args.ray + 0x140) = auVar83;
                          pRVar53 = args.ray;
                        }
                      }
                      if ((_DAT_01f46b40 & auVar120) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_14d8._0_4_;
                      }
                      else {
                        local_14d8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_14d8._4_4_ = 0;
                        fStack_14d0 = 0.0;
                        fStack_14cc = 0.0;
                      }
                      *(undefined4 *)(local_1448 + lVar67 * 4 + -0x10) = 0;
                      valid.field_0.i[0] =
                           -(uint)(auVar118._0_4_ <= (float)local_14d8._0_4_) & valid.field_0.i[0];
                      valid.field_0.i[1] =
                           -(uint)(auVar118._4_4_ <= (float)local_14d8._0_4_) & valid.field_0.i[1];
                      valid.field_0.i[2] =
                           -(uint)(auVar118._8_4_ <= (float)local_14d8._0_4_) & valid.field_0.i[2];
                      valid.field_0.i[3] =
                           -(uint)(auVar118._12_4_ <= (float)local_14d8._0_4_) & valid.field_0.i[3];
                      iVar46 = movmskps((int)pRVar53,(undefined1  [16])valid.field_0);
                      if (iVar46 == 0) break;
                      auVar113 = blendvps(_DAT_01f45a30,auVar118,(undefined1  [16])valid.field_0);
                      auVar161._4_4_ = auVar113._0_4_;
                      auVar161._0_4_ = auVar113._4_4_;
                      auVar161._8_4_ = auVar113._12_4_;
                      auVar161._12_4_ = auVar113._8_4_;
                      auVar83 = minps(auVar161,auVar113);
                      auVar121._0_8_ = auVar83._8_8_;
                      auVar121._8_4_ = auVar83._0_4_;
                      auVar121._12_4_ = auVar83._4_4_;
                      auVar83 = minps(auVar121,auVar83);
                      auVar122._0_8_ =
                           CONCAT44(-(uint)(auVar83._4_4_ == auVar113._4_4_) & valid.field_0.i[1],
                                    -(uint)(auVar83._0_4_ == auVar113._0_4_) & valid.field_0.i[0]);
                      auVar122._8_4_ = -(uint)(auVar83._8_4_ == auVar113._8_4_) & valid.field_0.i[2]
                      ;
                      auVar122._12_4_ =
                           -(uint)(auVar83._12_4_ == auVar113._12_4_) & valid.field_0.i[3];
                      iVar46 = movmskps(iVar46,auVar122);
                      aVar94 = valid.field_0;
                      if (iVar46 != 0) {
                        aVar94.i[2] = auVar122._8_4_;
                        aVar94._0_8_ = auVar122._0_8_;
                        aVar94.i[3] = auVar122._12_4_;
                      }
                      uVar56 = movmskps(iVar46,(undefined1  [16])aVar94);
                      uVar52 = CONCAT44((int)((ulong)pRVar53 >> 0x20),uVar56);
                      lVar67 = 0;
                      if (uVar52 != 0) {
                        for (; (uVar52 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                        }
                      }
                    }
                    fVar185 = *(float *)(ray + k * 4 + 0x10);
                    fVar110 = *(float *)(ray + k * 4 + 0x20);
                    fStack_147c = *(float *)(ray + k * 4 + 0x40);
                    local_14d8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
                    local_14d8._0_4_ = local_14d8._4_4_;
                    fStack_14d0 = (float)local_14d8._4_4_;
                    fStack_14cc = (float)local_14d8._4_4_;
                    local_14e8._4_4_ = *(float *)(ray + k * 4 + 0x60);
                    local_14e8._0_4_ = local_14e8._4_4_;
                    uStack_14e0._0_4_ = local_14e8._4_4_;
                    uStack_14e0._4_4_ = local_14e8._4_4_;
                    local_1468 = local_10a8 - fVar185;
                    fStack_1464 = fStack_10a4 - fVar185;
                    fStack_1460 = fStack_10a0 - fVar185;
                    fStack_145c = fStack_109c - fVar185;
                    fVar130 = (float)local_1078 - fVar110;
                    fVar262 = local_1078._4_4_ - fVar110;
                    fVar218 = fStack_1070 - fVar110;
                    fVar240 = fStack_106c - fVar110;
                    fVar203 = local_1098 - fVar185;
                    fVar246 = fStack_1094 - fVar185;
                    fVar247 = fStack_1090 - fVar185;
                    fVar248 = fStack_108c - fVar185;
                    fVar255 = local_1088 - fVar110;
                    fVar256 = fStack_1084 - fVar110;
                    fVar257 = fStack_1080 - fVar110;
                    fVar258 = fStack_107c - fVar110;
                    fStack_1394 = fStack_1464 + fVar246;
                    local_1398 = local_1468 + fVar203;
                    fStack_1390 = fStack_1460 + fVar247;
                    fStack_138c = fStack_145c + fVar248;
                    fStack_1384 = fVar262 + fVar256;
                    local_1388 = fVar130 + fVar255;
                    fStack_1380 = fVar218 + fVar257;
                    fStack_137c = fVar240 + fVar258;
                    uVar133 = 0;
                    lVar59 = local_1418;
                    lVar61 = local_1428;
                  }
                }
              }
            }
          }
          fVar111 = fVar231 - fVar110;
          fVar132 = fVar173 - fVar110;
          fStack_1270 = fStack_1270 - fVar110;
          fStack_126c = fStack_126c - fVar110;
          fVar206 = fVar206 - fVar185;
          fVar217 = fVar217 - fVar185;
          fVar214 = ((fVar167 - fVar150) * fVar186 + fVar150) - fVar185;
          fVar201 = fVar201 - fVar185;
          fVar171 = *(float *)(ray + k * 4);
          fVar229 = fVar173 - fVar171;
          fVar231 = fVar231 - fVar171;
          fStack_14a0 = fStack_14a0 - fVar171;
          fStack_149c = fStack_149c - fVar171;
          fVar222 = fVar222 - fVar171;
          fVar173 = fVar173 - fVar171;
          fVar150 = (float)local_1298._8_4_ - fVar171;
          fVar216 = fStack_128c - fVar171;
          fVar187 = fVar187 - fVar171;
          fVar169 = fVar169 - fVar171;
          fVar268 = fStack_1280 - fVar171;
          fVar171 = fStack_127c - fVar171;
          fVar239 = fVar187 - fVar229;
          fVar241 = fVar169 - fVar231;
          fStack_1410 = fVar268 - fStack_14a0;
          fStack_140c = fVar171 - fStack_149c;
          fVar167 = fVar203 - fVar206;
          fVar135 = fVar246 - fVar217;
          fStack_1280 = fVar247 - fVar214;
          fStack_127c = fVar248 - fVar201;
          fVar230 = fVar255 - fVar111;
          fVar233 = fVar256 - fVar132;
          fStack_1420 = fVar257 - fStack_1270;
          fStack_141c = fVar258 - fStack_126c;
          fVar186 = local_1468 - fVar203;
          fVar184 = fStack_1464 - fVar246;
          fVar185 = fStack_1460 - fVar247;
          fVar110 = fStack_145c - fVar248;
          fVar219 = fVar130 - fVar255;
          fVar220 = fVar262 - fVar256;
          fVar221 = fVar218 - fVar257;
          fVar228 = fVar240 - fVar258;
          local_1418 = CONCAT44(fVar241,fVar239);
          local_1428 = CONCAT44(fVar233,fVar230);
          fVar232 = fVar229 - fVar222;
          fVar234 = fVar231 - fVar173;
          fVar235 = fStack_14a0 - fVar150;
          fVar237 = fStack_149c - fVar216;
          fVar236 = fVar206 - local_1468;
          fVar263 = fVar217 - fStack_1464;
          fVar266 = fVar214 - fStack_1460;
          fVar267 = fVar201 - fStack_145c;
          fVar271 = (float)local_14e8;
          fVar272 = local_14e8._4_4_;
          fVar273 = local_14e8._8_4_;
          fVar274 = local_14e8._12_4_;
          fVar238 = fVar111 - fVar130;
          fVar213 = fVar132 - fVar262;
          fVar215 = fStack_1270 - fVar218;
          fVar207 = fStack_126c - fVar240;
          fVar255 = (fVar167 * (fVar255 + fVar111) - (fVar203 + fVar206) * fVar230) * fStack_147c +
                    ((fVar187 + fVar229) * fVar230 - (fVar255 + fVar111) * fVar239) *
                    (float)local_14d8._0_4_ +
                    (fVar239 * (fVar203 + fVar206) - (fVar187 + fVar229) * fVar167) * fVar271;
          fVar256 = (fVar135 * (fVar256 + fVar132) - (fVar246 + fVar217) * fVar233) * fStack_147c +
                    ((fVar169 + fVar231) * fVar233 - (fVar256 + fVar132) * fVar241) *
                    (float)local_14d8._4_4_ +
                    (fVar241 * (fVar246 + fVar217) - (fVar169 + fVar231) * fVar135) * fVar272;
          fVar257 = (fStack_1280 * (fVar257 + fStack_1270) - (fVar247 + fVar214) * fStack_1420) *
                    fStack_147c +
                    ((fVar268 + fStack_14a0) * fStack_1420 - (fVar257 + fStack_1270) * fStack_1410)
                    * fStack_14d0 +
                    (fStack_1410 * (fVar247 + fVar214) - (fVar268 + fStack_14a0) * fStack_1280) *
                    fVar273;
          fVar258 = (fStack_127c * (fVar258 + fStack_126c) - (fVar248 + fVar201) * fStack_141c) *
                    fStack_147c +
                    ((fVar171 + fStack_149c) * fStack_141c - (fVar258 + fStack_126c) * fStack_140c)
                    * fStack_14cc +
                    (fStack_140c * (fVar248 + fVar201) - (fVar171 + fStack_149c) * fStack_127c) *
                    fVar274;
          fVar203 = fVar222 - fVar187;
          fVar246 = fVar173 - fVar169;
          fVar247 = fVar150 - fVar268;
          fVar248 = fVar216 - fVar171;
          local_1298._0_4_ =
               (fVar236 * (fVar130 + fVar111) - (local_1468 + fVar206) * fVar238) * fStack_147c +
               ((fVar229 + fVar222) * fVar238 - (fVar130 + fVar111) * fVar232) *
               (float)local_14d8._0_4_ +
               (fVar232 * (local_1468 + fVar206) - (fVar229 + fVar222) * fVar236) * fVar271;
          local_1298._4_4_ =
               (fVar263 * (fVar262 + fVar132) - (fStack_1464 + fVar217) * fVar213) * fStack_147c +
               ((fVar231 + fVar173) * fVar213 - (fVar262 + fVar132) * fVar234) *
               (float)local_14d8._4_4_ +
               (fVar234 * (fStack_1464 + fVar217) - (fVar231 + fVar173) * fVar263) * fVar272;
          local_1298._8_4_ =
               (fVar266 * (fVar218 + fStack_1270) - (fStack_1460 + fVar214) * fVar215) * fStack_147c
               + ((fStack_14a0 + fVar150) * fVar215 - (fVar218 + fStack_1270) * fVar235) *
                 fStack_14d0 +
                 (fVar235 * (fStack_1460 + fVar214) - (fStack_14a0 + fVar150) * fVar266) * fVar273;
          fStack_128c = (fVar267 * (fVar240 + fStack_126c) - (fStack_145c + fVar201) * fVar207) *
                        fStack_147c +
                        ((fStack_149c + fVar216) * fVar207 - (fVar240 + fStack_126c) * fVar237) *
                        fStack_14cc +
                        (fVar237 * (fStack_145c + fVar201) - (fStack_149c + fVar216) * fVar267) *
                        fVar274;
          auVar95._0_4_ =
               (fVar186 * local_1388 - local_1398 * fVar219) * fStack_147c +
               ((fVar187 + fVar222) * fVar219 - local_1388 * fVar203) * (float)local_14d8._0_4_ +
               (fVar203 * local_1398 - (fVar187 + fVar222) * fVar186) * fVar271;
          auVar95._4_4_ =
               (fVar184 * fStack_1384 - fStack_1394 * fVar220) * fStack_147c +
               ((fVar169 + fVar173) * fVar220 - fStack_1384 * fVar246) * (float)local_14d8._4_4_ +
               (fVar246 * fStack_1394 - (fVar169 + fVar173) * fVar184) * fVar272;
          auVar95._8_4_ =
               (fVar185 * fStack_1380 - fStack_1390 * fVar221) * fStack_147c +
               ((fVar268 + fVar150) * fVar221 - fStack_1380 * fVar247) * fStack_14d0 +
               (fVar247 * fStack_1390 - (fVar268 + fVar150) * fVar185) * fVar273;
          auVar95._12_4_ =
               (fVar110 * fStack_137c - fStack_138c * fVar228) * fStack_147c +
               ((fVar171 + fVar216) * fVar228 - fStack_137c * fVar248) * fStack_14cc +
               (fVar248 * fStack_138c - (fVar171 + fVar216) * fVar110) * fVar274;
          fVar169 = fVar255 + local_1298._0_4_ + auVar95._0_4_;
          fVar130 = fVar256 + local_1298._4_4_ + auVar95._4_4_;
          fVar262 = fVar257 + (float)local_1298._8_4_ + auVar95._8_4_;
          fVar218 = fVar258 + fStack_128c + auVar95._12_4_;
          uVar52 = CONCAT44(fVar130,fVar169) & 0x7fffffff7fffffff;
          auVar123._8_4_ = fVar257;
          auVar123._0_8_ = CONCAT44(fVar256,fVar255);
          auVar123._12_4_ = fVar258;
          auVar83 = minps(auVar123,_local_1298);
          auVar83 = minps(auVar83,auVar95);
          auVar226._8_4_ = fVar257;
          auVar226._0_8_ = CONCAT44(fVar256,fVar255);
          auVar226._12_4_ = fVar258;
          auVar113 = maxps(auVar226,_local_1298);
          auVar113 = maxps(auVar113,auVar95);
          fVar171 = ABS(fVar262) * 1.1920929e-07;
          fVar150 = ABS(fVar218) * 1.1920929e-07;
          auVar227._4_4_ = -(uint)(auVar113._4_4_ <= ABS(fVar130) * 1.1920929e-07);
          auVar227._0_4_ = -(uint)(auVar113._0_4_ <= ABS(fVar169) * 1.1920929e-07);
          auVar227._8_4_ = -(uint)(auVar113._8_4_ <= fVar171);
          auVar227._12_4_ = -(uint)(auVar113._12_4_ <= fVar150);
          auVar124._4_4_ = -(uint)(-(ABS(fVar130) * 1.1920929e-07) <= auVar83._4_4_);
          auVar124._0_4_ = -(uint)(-(ABS(fVar169) * 1.1920929e-07) <= auVar83._0_4_);
          auVar124._8_4_ = -(uint)(-fVar171 <= auVar83._8_4_);
          auVar124._12_4_ = -(uint)(-fVar150 <= auVar83._12_4_);
          auVar227 = auVar227 | auVar124;
          iVar46 = movmskps(uVar133,auVar227);
          aVar223 = bi_2.field_0;
          if (iVar46 != 0) {
            auVar265._0_4_ = fVar167 * fVar238 - fVar236 * fVar230;
            auVar265._4_4_ = fVar135 * fVar213 - fVar263 * fVar233;
            auVar265._8_4_ = fStack_1280 * fVar215 - fVar266 * fStack_1420;
            auVar265._12_4_ = fStack_127c * fVar207 - fVar267 * fStack_141c;
            auVar252._0_4_ = fVar236 * fVar219 - fVar186 * fVar238;
            auVar252._4_4_ = fVar263 * fVar220 - fVar184 * fVar213;
            auVar252._8_4_ = fVar266 * fVar221 - fVar185 * fVar215;
            auVar252._12_4_ = fVar267 * fVar228 - fVar110 * fVar207;
            auVar96._4_4_ = -(uint)(ABS(fVar263 * fVar233) < ABS(fVar184 * fVar213));
            auVar96._0_4_ = -(uint)(ABS(fVar236 * fVar230) < ABS(fVar186 * fVar238));
            auVar96._8_4_ = -(uint)(ABS(fVar266 * fStack_1420) < ABS(fVar185 * fVar215));
            auVar96._12_4_ = -(uint)(ABS(fVar267 * fStack_141c) < ABS(fVar110 * fVar207));
            local_12d8 = blendvps(auVar252,auVar265,auVar96);
            auVar192._0_4_ = fVar230 * fVar232 - fVar239 * fVar238;
            auVar192._4_4_ = fVar233 * fVar234 - fVar241 * fVar213;
            auVar192._8_4_ = fStack_1420 * fVar235 - fStack_1410 * fVar215;
            auVar192._12_4_ = fStack_141c * fVar237 - fStack_140c * fVar207;
            auVar261._0_4_ = fVar203 * fVar238 - fVar232 * fVar219;
            auVar261._4_4_ = fVar246 * fVar213 - fVar234 * fVar220;
            auVar261._8_4_ = fVar247 * fVar215 - fVar235 * fVar221;
            auVar261._12_4_ = fVar248 * fVar207 - fVar237 * fVar228;
            auVar97._4_4_ = -(uint)(ABS(fVar241 * fVar213) < ABS(fVar234 * fVar220));
            auVar97._0_4_ = -(uint)(ABS(fVar239 * fVar238) < ABS(fVar232 * fVar219));
            auVar97._8_4_ = -(uint)(ABS(fStack_1410 * fVar215) < ABS(fVar235 * fVar221));
            auVar97._12_4_ = -(uint)(ABS(fStack_140c * fVar207) < ABS(fVar237 * fVar228));
            local_12c8 = blendvps(auVar261,auVar192,auVar97);
            auVar183._0_4_ = fVar239 * fVar236 - fVar232 * fVar167;
            auVar183._4_4_ = fVar241 * fVar263 - fVar234 * fVar135;
            auVar183._8_4_ = fStack_1410 * fVar266 - fVar235 * fStack_1280;
            auVar183._12_4_ = fStack_140c * fVar267 - fVar237 * fStack_127c;
            auVar243._0_4_ = fVar232 * fVar186 - fVar203 * fVar236;
            auVar243._4_4_ = fVar234 * fVar184 - fVar246 * fVar263;
            auVar243._8_4_ = fVar235 * fVar185 - fVar247 * fVar266;
            auVar243._12_4_ = fVar237 * fVar110 - fVar248 * fVar267;
            auVar98._4_4_ = -(uint)(ABS(fVar234 * fVar135) < ABS(fVar246 * fVar263));
            auVar98._0_4_ = -(uint)(ABS(fVar232 * fVar167) < ABS(fVar203 * fVar236));
            auVar98._8_4_ = -(uint)(ABS(fVar235 * fStack_1280) < ABS(fVar247 * fVar266));
            auVar98._12_4_ = -(uint)(ABS(fVar237 * fStack_127c) < ABS(fVar248 * fVar267));
            local_12b8 = blendvps(auVar243,auVar183,auVar98);
            auVar162._0_4_ = (float)local_14d8._0_4_ * local_12c8._0_4_ + fVar271 * local_12b8._0_4_
            ;
            auVar162._4_4_ = (float)local_14d8._4_4_ * local_12c8._4_4_ + fVar272 * local_12b8._4_4_
            ;
            auVar162._8_4_ = fStack_14d0 * local_12c8._8_4_ + fVar273 * local_12b8._8_4_;
            auVar162._12_4_ = fStack_14cc * local_12c8._12_4_ + fVar274 * local_12b8._12_4_;
            fVar171 = fStack_147c * local_12d8._0_4_ + auVar162._0_4_;
            fVar186 = fStack_147c * local_12d8._4_4_ + auVar162._4_4_;
            fVar184 = fStack_147c * local_12d8._8_4_ + auVar162._8_4_;
            fVar185 = fStack_147c * local_12d8._12_4_ + auVar162._12_4_;
            auVar200._0_4_ = fVar171 + fVar171;
            auVar200._4_4_ = fVar186 + fVar186;
            auVar200._8_4_ = fVar184 + fVar184;
            auVar200._12_4_ = fVar185 + fVar185;
            auVar99._0_4_ = fVar206 * local_12c8._0_4_ + fVar111 * local_12b8._0_4_;
            auVar99._4_4_ = fVar217 * local_12c8._4_4_ + fVar132 * local_12b8._4_4_;
            auVar99._8_4_ = fVar214 * local_12c8._8_4_ + fStack_1270 * local_12b8._8_4_;
            auVar99._12_4_ = fVar201 * local_12c8._12_4_ + fStack_126c * local_12b8._12_4_;
            fVar110 = fVar229 * local_12d8._0_4_ + auVar99._0_4_;
            fVar150 = fVar231 * local_12d8._4_4_ + auVar99._4_4_;
            fVar167 = fStack_14a0 * local_12d8._8_4_ + auVar99._8_4_;
            fVar111 = fStack_149c * local_12d8._12_4_ + auVar99._12_4_;
            auVar83 = rcpps(auVar99,auVar200);
            fVar171 = auVar83._0_4_;
            fVar186 = auVar83._4_4_;
            fVar184 = auVar83._8_4_;
            fVar185 = auVar83._12_4_;
            auVar125._0_4_ =
                 ((1.0 - auVar200._0_4_ * fVar171) * fVar171 + fVar171) * (fVar110 + fVar110);
            auVar125._4_4_ =
                 ((1.0 - auVar200._4_4_ * fVar186) * fVar186 + fVar186) * (fVar150 + fVar150);
            auVar125._8_4_ =
                 ((1.0 - auVar200._8_4_ * fVar184) * fVar184 + fVar184) * (fVar167 + fVar167);
            auVar125._12_4_ =
                 ((1.0 - auVar200._12_4_ * fVar185) * fVar185 + fVar185) * (fVar111 + fVar111);
            fVar186 = *(float *)(ray + k * 4 + 0x80);
            fVar171 = *(float *)(ray + k * 4 + 0x30);
            auVar100._0_4_ =
                 -(uint)(auVar125._0_4_ <= fVar186 && fVar171 <= auVar125._0_4_) & auVar227._0_4_;
            auVar100._4_4_ =
                 -(uint)(auVar125._4_4_ <= fVar186 && fVar171 <= auVar125._4_4_) & auVar227._4_4_;
            auVar100._8_4_ =
                 -(uint)(auVar125._8_4_ <= fVar186 && fVar171 <= auVar125._8_4_) & auVar227._8_4_;
            auVar100._12_4_ =
                 -(uint)(auVar125._12_4_ <= fVar186 && fVar171 <= auVar125._12_4_) & auVar227._12_4_
            ;
            iVar46 = movmskps(iVar46,auVar100);
            if (iVar46 != 0) {
              valid.field_0.i[0] = auVar100._0_4_ & -(uint)(auVar200._0_4_ != 0.0);
              valid.field_0.i[1] = auVar100._4_4_ & -(uint)(auVar200._4_4_ != 0.0);
              valid.field_0.i[2] = auVar100._8_4_ & -(uint)(auVar200._8_4_ != 0.0);
              valid.field_0.i[3] = auVar100._12_4_ & -(uint)(auVar200._12_4_ != 0.0);
              iVar46 = movmskps(iVar46,(undefined1  [16])valid.field_0);
              if (iVar46 != 0) {
                local_12e8 = auVar125;
                auVar193._0_4_ = fVar169 - local_1298._0_4_;
                auVar193._4_4_ = fVar130 - local_1298._4_4_;
                auVar193._8_4_ = fVar262 - (float)local_1298._8_4_;
                auVar193._12_4_ = fVar218 - fStack_128c;
                auVar163._4_12_ = auVar162._4_12_;
                auVar163._0_4_ = (float)(int)(*(ushort *)(lVar59 + 8 + lVar61) - 1);
                auVar244._4_4_ = auVar162._4_4_;
                auVar244._0_4_ = auVar163._0_4_;
                auVar244._8_4_ = auVar162._8_4_;
                auVar244._12_4_ = auVar162._12_4_;
                auVar83 = rcpss(auVar244,auVar163);
                fVar171 = (2.0 - auVar163._0_4_ * auVar83._0_4_) * auVar83._0_4_;
                auVar245._4_12_ = auVar83._4_12_;
                auVar245._0_4_ = (float)(int)(*(ushort *)(lVar59 + 10 + lVar61) - 1);
                auVar253._4_4_ = auVar83._4_4_;
                auVar253._0_4_ = auVar245._0_4_;
                auVar253._8_4_ = auVar83._8_4_;
                auVar253._12_4_ = auVar83._12_4_;
                auVar83 = rcpss(auVar253,auVar245);
                fVar184 = (2.0 - auVar245._0_4_ * auVar83._0_4_) * auVar83._0_4_;
                tNear.field_0.v[0] = fVar171 * ((float)uVar134 * fVar169 + (fVar169 - fVar255));
                tNear.field_0.v[1] =
                     fVar171 * ((float)(uVar134 + 1) * fVar130 + (fVar130 - fVar256));
                tNear.field_0.v[2] =
                     fVar171 * ((float)(uVar134 + 1) * fVar262 + (fVar262 - fVar257));
                tNear.field_0.v[3] = fVar171 * ((float)uVar134 * fVar218 + (fVar218 - fVar258));
                pGVar24 = (context->scene->geometries).items[uVar55].ptr;
                if ((pGVar24->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar41._4_4_ = fVar130;
                  auVar41._0_4_ = fVar169;
                  auVar41._8_4_ = fVar262;
                  auVar41._12_4_ = fVar218;
                  auVar83 = rcpps(auVar193,auVar41);
                  fVar171 = auVar83._0_4_;
                  fVar185 = auVar83._4_4_;
                  fVar110 = auVar83._8_4_;
                  fVar150 = auVar83._12_4_;
                  local_1478 = (float)uVar52;
                  fStack_1474 = (float)(uVar52 >> 0x20);
                  fVar171 = (float)(-(uint)(1e-18 <= local_1478) &
                                   (uint)(((float)DAT_01f46a60 - fVar169 * fVar171) * fVar171 +
                                         fVar171));
                  fVar185 = (float)(-(uint)(1e-18 <= fStack_1474) &
                                   (uint)((DAT_01f46a60._4_4_ - fVar130 * fVar185) * fVar185 +
                                         fVar185));
                  fVar110 = (float)(-(uint)(1e-18 <= ABS(fVar262)) &
                                   (uint)((DAT_01f46a60._8_4_ - fVar262 * fVar110) * fVar110 +
                                         fVar110));
                  fVar150 = (float)(-(uint)(1e-18 <= ABS(fVar218)) &
                                   (uint)((DAT_01f46a60._12_4_ - fVar218 * fVar150) * fVar150 +
                                         fVar150));
                  auVar145._0_4_ = tNear.field_0.v[0] * fVar171;
                  auVar145._4_4_ = tNear.field_0.v[1] * fVar185;
                  auVar145._8_4_ = tNear.field_0.v[2] * fVar110;
                  auVar145._12_4_ = tNear.field_0.v[3] * fVar150;
                  local_1308 = minps(auVar145,_DAT_01f46a60);
                  auVar164._0_4_ = fVar184 * ((float)uVar136 * fVar169 + auVar193._0_4_) * fVar171;
                  auVar164._4_4_ = fVar184 * ((float)uVar136 * fVar130 + auVar193._4_4_) * fVar185;
                  auVar164._8_4_ =
                       fVar184 * ((float)(uVar136 + 1) * fVar262 + auVar193._8_4_) * fVar110;
                  auVar164._12_4_ =
                       fVar184 * ((float)(uVar136 + 1) * fVar218 + auVar193._12_4_) * fVar150;
                  local_12f8 = minps(auVar164,_DAT_01f46a60);
                  auVar113 = blendvps(_DAT_01f45a30,auVar125,(undefined1  [16])valid.field_0);
                  auVar165._4_4_ = auVar113._0_4_;
                  auVar165._0_4_ = auVar113._4_4_;
                  auVar165._8_4_ = auVar113._12_4_;
                  auVar165._12_4_ = auVar113._8_4_;
                  auVar83 = minps(auVar165,auVar113);
                  auVar126._0_8_ = auVar83._8_8_;
                  auVar126._8_4_ = auVar83._0_4_;
                  auVar126._12_4_ = auVar83._4_4_;
                  auVar83 = minps(auVar126,auVar83);
                  uVar148 = -(uint)(auVar83._0_4_ == auVar113._0_4_);
                  uVar149 = -(uint)(auVar83._4_4_ == auVar113._4_4_);
                  uVar151 = -(uint)(auVar83._8_4_ == auVar113._8_4_);
                  uVar168 = -(uint)(auVar83._12_4_ == auVar113._12_4_);
                  auVar146._0_4_ = uVar148 & valid.field_0.i[0];
                  auVar146._4_4_ = uVar149 & valid.field_0.i[1];
                  auVar146._8_4_ = uVar151 & valid.field_0.i[2];
                  auVar146._12_4_ = uVar168 & valid.field_0.i[3];
                  iVar46 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar146);
                  uVar133 = 0xffffffff;
                  uVar134 = 0xffffffff;
                  uVar136 = 0xffffffff;
                  uVar147 = 0xffffffff;
                  if (iVar46 != 0) {
                    uVar133 = uVar148;
                    uVar134 = uVar149;
                    uVar136 = uVar151;
                    uVar147 = uVar168;
                  }
                  auVar101._0_4_ = valid.field_0.i[0] & uVar133;
                  auVar101._4_4_ = valid.field_0.i[1] & uVar134;
                  auVar101._8_4_ = valid.field_0.i[2] & uVar136;
                  auVar101._12_4_ = valid.field_0.i[3] & uVar147;
                  uVar133 = movmskps(iVar46,auVar101);
                  lVar59 = 0;
                  if (uVar133 != 0) {
                    for (; (uVar133 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar24->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar56 = *(undefined4 *)(local_1308 + lVar59 * 4);
                    uVar16 = *(undefined4 *)(local_12f8 + lVar59 * 4);
                    uVar17 = *(undefined4 *)(local_12d8 + lVar59 * 4);
                    uVar18 = *(undefined4 *)(local_12c8 + lVar59 * 4);
                    uVar19 = *(undefined4 *)(local_12b8 + lVar59 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12e8 + lVar59 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar17;
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar18;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar19;
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar56;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar16;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_1430;
                    *(uint *)(ray + k * 4 + 0x120) = uVar55;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_14e8 = CONCAT44(uVar55,uVar55);
                    uStack_14e0._0_4_ = uVar55;
                    uStack_14e0._4_4_ = uVar55;
                    auVar44 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar47);
                    fStack_14a0 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar47 + 8);
                    fStack_149c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar47 + 8) >>
                                         0x20);
                    while( true ) {
                      local_1148 = *(undefined4 *)(local_1308 + lVar59 * 4);
                      uVar56 = *(undefined4 *)(local_12f8 + lVar59 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12e8 + lVar59 * 4)
                      ;
                      args.context = context->user;
                      local_1138._4_4_ = uVar56;
                      local_1138._0_4_ = uVar56;
                      local_1138._8_4_ = uVar56;
                      local_1138._12_4_ = uVar56;
                      local_1178 = *(undefined4 *)(local_12d8 + lVar59 * 4);
                      uVar56 = *(undefined4 *)(local_12c8 + lVar59 * 4);
                      uVar16 = *(undefined4 *)(local_12b8 + lVar59 * 4);
                      local_1168._4_4_ = uVar56;
                      local_1168._0_4_ = uVar56;
                      local_1168._8_4_ = uVar56;
                      local_1168._12_4_ = uVar56;
                      local_1158._4_4_ = uVar16;
                      local_1158._0_4_ = uVar16;
                      local_1158._8_4_ = uVar16;
                      local_1158._12_4_ = uVar16;
                      uStack_1174 = local_1178;
                      uStack_1170 = local_1178;
                      uStack_116c = local_1178;
                      uStack_1144 = local_1148;
                      uStack_1140 = local_1148;
                      uStack_113c = local_1148;
                      local_1128 = CONCAT44(uVar131,uVar131);
                      uStack_1120 = CONCAT44(uVar131,uVar131);
                      local_1118 = local_14e8;
                      uStack_1110 = uStack_14e0;
                      local_1108 = (args.context)->instID[0];
                      uStack_1104 = local_1108;
                      uStack_1100 = local_1108;
                      uStack_10fc = local_1108;
                      local_10f8 = (args.context)->instPrimID[0];
                      uStack_10f4 = local_10f8;
                      uStack_10f0 = local_10f8;
                      uStack_10ec = local_10f8;
                      local_1448._12_4_ = fStack_149c;
                      local_1448._0_12_ = auVar44;
                      args.valid = (int *)local_1448;
                      args.geometryUserPtr = pGVar24->userPtr;
                      args.hit = (RTCHitN *)&local_1178;
                      args.N = 4;
                      pRVar53 = (RTCRayN *)pGVar24->intersectionFilterN;
                      args.ray = (RTCRayN *)ray;
                      if (pRVar53 != (RTCRayN *)0x0) {
                        pRVar53 = (RTCRayN *)(*(code *)pRVar53)(&args);
                      }
                      if (local_1448 == (undefined1  [16])0x0) {
                        auVar127._8_4_ = 0xffffffff;
                        auVar127._0_8_ = 0xffffffffffffffff;
                        auVar127._12_4_ = 0xffffffff;
                        auVar127 = auVar127 ^ _DAT_01f46b70;
                      }
                      else {
                        pRVar53 = (RTCRayN *)context->args->filter;
                        if ((pRVar53 != (RTCRayN *)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                          pRVar53 = (RTCRayN *)(*(code *)pRVar53)(&args);
                        }
                        auVar102._0_4_ = -(uint)(local_1448._0_4_ == 0);
                        auVar102._4_4_ = -(uint)(local_1448._4_4_ == 0);
                        auVar102._8_4_ = -(uint)(local_1448._8_4_ == 0);
                        auVar102._12_4_ = -(uint)(local_1448._12_4_ == 0);
                        auVar127 = auVar102 ^ _DAT_01f46b70;
                        if (local_1448 != (undefined1  [16])0x0) {
                          auVar83 = blendvps(*(undefined1 (*) [16])args.hit,
                                             *(undefined1 (*) [16])(args.ray + 0xc0),auVar102);
                          *(undefined1 (*) [16])(args.ray + 0xc0) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                             *(undefined1 (*) [16])(args.ray + 0xd0),auVar102);
                          *(undefined1 (*) [16])(args.ray + 0xd0) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                             *(undefined1 (*) [16])(args.ray + 0xe0),auVar102);
                          *(undefined1 (*) [16])(args.ray + 0xe0) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                             *(undefined1 (*) [16])(args.ray + 0xf0),auVar102);
                          *(undefined1 (*) [16])(args.ray + 0xf0) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                             *(undefined1 (*) [16])(args.ray + 0x100),auVar102);
                          *(undefined1 (*) [16])(args.ray + 0x100) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                             *(undefined1 (*) [16])(args.ray + 0x110),auVar102);
                          *(undefined1 (*) [16])(args.ray + 0x110) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                             *(undefined1 (*) [16])(args.ray + 0x120),auVar102);
                          *(undefined1 (*) [16])(args.ray + 0x120) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                             *(undefined1 (*) [16])(args.ray + 0x130),auVar102);
                          *(undefined1 (*) [16])(args.ray + 0x130) = auVar83;
                          auVar83 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                             *(undefined1 (*) [16])(args.ray + 0x140),auVar102);
                          *(undefined1 (*) [16])(args.ray + 0x140) = auVar83;
                          pRVar53 = args.ray;
                        }
                      }
                      if ((_DAT_01f46b40 & auVar127) == (undefined1  [16])0x0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar186;
                      }
                      else {
                        fVar186 = *(float *)(ray + k * 4 + 0x80);
                      }
                      *(undefined4 *)(local_1448 + lVar59 * 4 + -0x10) = 0;
                      valid.field_0.i[0] = -(uint)(auVar125._0_4_ <= fVar186) & valid.field_0.i[0];
                      valid.field_0.i[1] = -(uint)(auVar125._4_4_ <= fVar186) & valid.field_0.i[1];
                      valid.field_0.i[2] = -(uint)(auVar125._8_4_ <= fVar186) & valid.field_0.i[2];
                      valid.field_0.i[3] = -(uint)(auVar125._12_4_ <= fVar186) & valid.field_0.i[3];
                      iVar46 = movmskps((int)pRVar53,(undefined1  [16])valid.field_0);
                      aVar223 = bi_2.field_0;
                      if (iVar46 == 0) break;
                      auVar113 = blendvps(_DAT_01f45a30,auVar125,(undefined1  [16])valid.field_0);
                      auVar166._4_4_ = auVar113._0_4_;
                      auVar166._0_4_ = auVar113._4_4_;
                      auVar166._8_4_ = auVar113._12_4_;
                      auVar166._12_4_ = auVar113._8_4_;
                      auVar83 = minps(auVar166,auVar113);
                      auVar128._0_8_ = auVar83._8_8_;
                      auVar128._8_4_ = auVar83._0_4_;
                      auVar128._12_4_ = auVar83._4_4_;
                      auVar83 = minps(auVar128,auVar83);
                      auVar129._0_8_ =
                           CONCAT44(-(uint)(auVar83._4_4_ == auVar113._4_4_) & valid.field_0.i[1],
                                    -(uint)(auVar83._0_4_ == auVar113._0_4_) & valid.field_0.i[0]);
                      auVar129._8_4_ = -(uint)(auVar83._8_4_ == auVar113._8_4_) & valid.field_0.i[2]
                      ;
                      auVar129._12_4_ =
                           -(uint)(auVar83._12_4_ == auVar113._12_4_) & valid.field_0.i[3];
                      iVar46 = movmskps(iVar46,auVar129);
                      aVar103 = valid.field_0;
                      if (iVar46 != 0) {
                        aVar103.i[2] = auVar129._8_4_;
                        aVar103._0_8_ = auVar129._0_8_;
                        aVar103.i[3] = auVar129._12_4_;
                      }
                      uVar56 = movmskps(iVar46,(undefined1  [16])aVar103);
                      uVar52 = CONCAT44((int)((ulong)pRVar53 >> 0x20),uVar56);
                      lVar59 = 0;
                      if (uVar52 != 0) {
                        for (; (uVar52 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar52 = 0;
      auVar83 = local_10c8;
      fVar184 = local_10d8;
      fVar185 = fStack_10d4;
      fVar110 = fStack_10d0;
      fVar186 = fStack_10cc;
      fVar150 = local_10b8;
      fVar167 = fStack_10b4;
      fVar169 = fStack_10b0;
      fVar171 = fStack_10ac;
      fVar111 = local_10e8;
      fVar130 = fStack_10e4;
      fVar132 = fStack_10e0;
      fVar262 = fStack_10dc;
    }
    uVar56 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar242._4_4_ = uVar56;
    auVar242._0_4_ = uVar56;
    auVar242._8_4_ = uVar56;
    auVar242._12_4_ = uVar56;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }